

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O3

void av1_compute_stats_avx2
               (int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,int use_downsampled_wiener_stats)

{
  int64_t iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ushort uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  char cVar14;
  int iVar15;
  uint8_t *puVar16;
  ulong uVar17;
  int16_t *piVar18;
  undefined1 (*pauVar19) [32];
  undefined1 (*pauVar20) [32];
  uint uVar21;
  int16_t *piVar22;
  int16_t *piVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  undefined1 (*pauVar27) [32];
  uint uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  undefined1 (*pauVar36) [32];
  int iVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  uint uVar41;
  int iVar42;
  bool bVar43;
  ushort uVar44;
  undefined1 auVar45 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  ulong local_290;
  ulong local_288;
  long local_280;
  ulong local_278;
  long local_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if ((wiener_win & 0xfffffffdU) == 5) {
    lVar34 = (long)h_start;
    uVar41 = h_end - h_start;
    iVar42 = v_end - v_start;
    uVar21 = uVar41 & 0x1f;
    if (uVar21 < 0x10) {
      auVar2 = *(undefined1 (*) [16])(mask_8bit + (0x10 - (ulong)uVar21));
      auVar46 = (undefined1  [16])0x0;
    }
    else {
      auVar46 = *(undefined1 (*) [16])((long)mask_16bit - (ulong)uVar21);
      auVar2 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    }
    puVar16 = dgd + dgd_stride * v_start + lVar34;
    auVar45._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar2;
    auVar45._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
    iVar15 = 1;
    if (1 < iVar42) {
      iVar15 = iVar42;
    }
    iVar37 = 0;
    auVar49 = ZEXT1664((undefined1  [16])0x0);
    do {
      lVar29 = 0;
      if (0 < (int)(uVar41 & 0xffffffe0)) {
        do {
          auVar68 = vpsadbw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                 *(undefined1 (*) [32])(puVar16 + lVar29));
          auVar68 = vpaddd_avx2(auVar49._0_32_,auVar68);
          auVar49 = ZEXT3264(auVar68);
          lVar29 = lVar29 + 0x20;
        } while (lVar29 < (int)(uVar41 & 0xffffffe0));
      }
      if (uVar21 != 0) {
        auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(puVar16 + lVar29));
        auVar68 = vpsadbw_avx2(auVar68,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar68 = vpaddd_avx2(auVar49._0_32_,auVar68);
        auVar49 = ZEXT3264(auVar68);
      }
      puVar16 = puVar16 + dgd_stride;
      iVar37 = iVar37 + 1;
    } while (iVar37 != iVar15);
    auVar46 = vphaddd_avx(auVar49._16_16_,auVar49._0_16_);
    auVar46 = vphaddd_avx(auVar46,auVar46);
    auVar46 = vphaddd_avx(auVar46,auVar46);
    iVar37 = 0;
    uVar21 = wiener_win & 6;
    uVar28 = uVar41 + 0xf & 0xfffffff0;
    puVar16 = src + src_stride * v_start + lVar34;
    uVar5 = (ushort)(auVar46._0_4_ / (iVar42 * uVar41));
    uVar44 = uVar5 & 0xff;
    auVar68._0_8_ = CONCAT26(uVar5,CONCAT24(uVar5,CONCAT22(uVar5,uVar5))) & 0xff00ff00ff00ff;
    auVar68._8_2_ = uVar44;
    auVar68._10_2_ = uVar44;
    auVar68._12_2_ = uVar44;
    auVar68._14_2_ = uVar44;
    auVar68._16_2_ = uVar44;
    auVar68._18_2_ = uVar44;
    auVar68._20_2_ = uVar44;
    auVar68._22_2_ = uVar44;
    auVar68._24_2_ = uVar44;
    auVar68._26_2_ = uVar44;
    auVar68._28_2_ = uVar44;
    auVar68._30_2_ = uVar44;
    iVar15 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
    piVar18 = src_avg;
    do {
      iVar32 = iVar42 - iVar37;
      if (3 < iVar42 - iVar37) {
        iVar32 = iVar15;
      }
      if (use_downsampled_wiener_stats == 0) {
        iVar32 = 1;
      }
      if (0 < (int)uVar41) {
        lVar29 = 0;
        do {
          auVar45 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar16 + lVar29));
          auVar45 = vpsubw_avx2(auVar45,auVar68);
          *(undefined1 (*) [32])(piVar18 + lVar29) = auVar45;
          lVar29 = lVar29 + 0x10;
        } while (lVar29 < (int)uVar41);
      }
      puVar16 = puVar16 + iVar32 * src_stride;
      piVar18 = piVar18 + (int)(iVar32 * uVar28);
      iVar37 = iVar37 + iVar32;
    } while (iVar37 < iVar42);
    uVar24 = uVar21 + uVar41 + 0xf & 0xfffffff0;
    puVar16 = dgd + (((int)((v_start - ((uint)wiener_win >> 1)) * dgd_stride) + lVar34) -
                    (ulong)((uint)wiener_win >> 1));
    iVar37 = 1;
    if (1 < (int)(iVar42 + uVar21)) {
      iVar37 = iVar42 + uVar21;
    }
    lVar29 = (long)(int)uVar24;
    lVar34 = lVar29 * 2;
    iVar42 = 0;
    piVar18 = dgd_avg;
    do {
      if (0 < (int)(uVar41 + uVar21)) {
        lVar35 = 0;
        do {
          auVar45 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar16 + lVar35));
          auVar45 = vpsubw_avx2(auVar45,auVar68);
          *(undefined1 (*) [32])(piVar18 + lVar35) = auVar45;
          lVar35 = lVar35 + 0x10;
        } while (lVar35 < (int)(uVar41 + uVar21));
      }
      puVar16 = puVar16 + dgd_stride;
      iVar42 = iVar42 + 1;
      piVar18 = piVar18 + lVar29;
    } while (iVar42 != iVar37);
    if (wiener_win == 5) {
      uVar21 = uVar41 & 0xfffffff0;
      uVar41 = uVar41 & 0xf;
      auVar45 = *(undefined1 (*) [32])(mask_16bit + (0x10 - uVar41));
      lVar35 = (long)(int)uVar21;
      lVar39 = 0;
      lVar30 = 0;
      do {
        local_1c0._0_16_ = ZEXT816(0);
        local_1c0 = ZEXT1632(local_1c0._0_16_);
        local_1e0._0_16_ = ZEXT816(0);
        local_1e0 = ZEXT1632(local_1e0._0_16_);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_c0 = 0;
        uStack_b8 = 0;
        uStack_b0 = 0;
        uStack_a8 = 0;
        local_e0 = 0;
        uStack_d8 = 0;
        uStack_d0 = 0;
        uStack_c8 = 0;
        local_100 = 0;
        uStack_f8 = 0;
        uStack_f0 = 0;
        uStack_e8 = 0;
        local_120 = 0;
        uStack_118 = 0;
        uStack_110 = 0;
        uStack_108 = 0;
        local_140 = 0;
        uStack_138 = 0;
        uStack_130 = 0;
        uStack_128 = 0;
        piVar22 = dgd_avg;
        piVar18 = src_avg;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar48._0_2_ = (undefined2)iVar37;
          auVar48._2_2_ = auVar48._0_2_;
          auVar48._4_2_ = auVar48._0_2_;
          auVar48._6_2_ = auVar48._0_2_;
          auVar48._8_2_ = auVar48._0_2_;
          auVar48._10_2_ = auVar48._0_2_;
          auVar48._12_2_ = auVar48._0_2_;
          auVar48._14_2_ = auVar48._0_2_;
          auVar48._16_2_ = auVar48._0_2_;
          auVar48._18_2_ = auVar48._0_2_;
          auVar48._20_2_ = auVar48._0_2_;
          auVar48._22_2_ = auVar48._0_2_;
          auVar48._24_2_ = auVar48._0_2_;
          auVar48._26_2_ = auVar48._0_2_;
          auVar48._28_2_ = auVar48._0_2_;
          auVar48._30_2_ = auVar48._0_2_;
          if ((int)uVar21 < 1) {
            uVar33 = 0;
          }
          else {
            pauVar19 = (undefined1 (*) [32])((long)piVar22 + lVar39);
            uVar33 = 0;
            do {
              auVar68 = vpmullw_avx2(auVar48,*(undefined1 (*) [32])(piVar18 + uVar33));
              auVar47 = vpmullw_avx2(auVar48,*(undefined1 (*) [32])(piVar22 + uVar33));
              lVar25 = 0;
              pauVar20 = pauVar19;
              do {
                auVar3 = *pauVar20;
                auVar4 = vpmaddwd_avx2(auVar68,auVar3);
                auVar4 = vpaddd_avx2(auVar4,*(undefined1 (*) [32])(local_240 + lVar25));
                *(undefined1 (*) [32])(local_240 + lVar25) = auVar4;
                auVar3 = vpmaddwd_avx2(auVar47,auVar3);
                auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])((long)&local_140 + lVar25));
                *(undefined1 (*) [32])((long)&local_140 + lVar25) = auVar3;
                lVar25 = lVar25 + 0x20;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
              } while (lVar25 != 0xa0);
              uVar33 = uVar33 + 0x10;
              pauVar19 = pauVar19 + 1;
            } while ((long)uVar33 < lVar35);
            uVar33 = uVar33 & 0xffffffff;
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar18 + uVar33));
            auVar47 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar22 + uVar33));
            auVar68 = vpmullw_avx2(auVar48,auVar68);
            auVar48 = vpmullw_avx2(auVar48,auVar47);
            pauVar19 = (undefined1 (*) [32])(*(undefined1 (*) [32])(piVar22 + uVar33) + lVar39);
            lVar25 = 0;
            do {
              auVar47 = *pauVar19;
              auVar3 = vpmaddwd_avx2(auVar68,auVar47);
              auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])(local_240 + lVar25));
              *(undefined1 (*) [32])(local_240 + lVar25) = auVar3;
              auVar47 = vpmaddwd_avx2(auVar48,auVar47);
              auVar47 = vpaddd_avx2(auVar47,*(undefined1 (*) [32])((long)&local_140 + lVar25));
              *(undefined1 (*) [32])((long)&local_140 + lVar25) = auVar47;
              lVar25 = lVar25 + 0x20;
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
            } while (lVar25 != 0xa0);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar28);
          piVar22 = piVar22 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vphaddd_avx2(local_240,local_220);
        auVar48 = vphaddd_avx2(local_200,local_1e0);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar47 = vpmovsxdq_avx2(local_1c0._0_16_);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        auVar48 = vpmovsxdq_avx2(local_1c0._16_16_);
        auVar48 = vpaddq_avx2(auVar47,auVar48);
        auVar46._8_8_ = uStack_b8;
        auVar46._0_8_ = local_c0;
        auVar47 = vpmovsxdq_avx2(auVar46);
        auVar2._8_8_ = uStack_a8;
        auVar2._0_8_ = uStack_b0;
        auVar3 = vpmovsxdq_avx2(auVar2);
        auVar47 = vpaddq_avx2(auVar47,auVar3);
        auVar3 = vpunpcklqdq_avx2(auVar48,auVar47);
        auVar48 = vpunpckhqdq_avx2(auVar48,auVar47);
        auVar48 = vpaddq_avx2(auVar3,auVar48);
        auVar46 = vpaddq_avx(auVar48._0_16_,auVar48._16_16_);
        *(undefined1 (*) [32])(M + lVar30 * 5) = auVar68;
        M[lVar30 * 5 + 4] = auVar46._0_8_;
        auVar47._8_8_ = uStack_138;
        auVar47._0_8_ = local_140;
        auVar47._16_8_ = uStack_130;
        auVar47._24_8_ = uStack_128;
        auVar4._8_8_ = uStack_f8;
        auVar4._0_8_ = local_100;
        auVar4._16_8_ = uStack_f0;
        auVar4._24_8_ = uStack_e8;
        auVar3._8_8_ = uStack_118;
        auVar3._0_8_ = local_120;
        auVar3._16_8_ = uStack_110;
        auVar3._24_8_ = uStack_108;
        auVar68 = vphaddd_avx2(auVar47,auVar3);
        auVar10._8_8_ = uStack_d8;
        auVar10._0_8_ = local_e0;
        auVar10._16_8_ = uStack_d0;
        auVar10._24_8_ = uStack_c8;
        auVar48 = vphaddd_avx2(auVar4,auVar10);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        *(undefined1 (*) [32])(H + lVar30 * 5) = auVar68;
        iVar1 = vpextrq_avx(auVar46,1);
        H[lVar30 * 5 + 4] = iVar1;
        lVar30 = lVar30 + 1;
        lVar39 = lVar39 + 2;
      } while (lVar30 != 5);
      uVar33 = 1;
      local_278 = 2;
      local_290 = 1;
      do {
        piVar18 = dgd_avg + ((uint)uVar33 & 0xff) / 5;
        piVar22 = piVar18 + lVar29;
        local_1c0._0_16_ = ZEXT816(0);
        local_1c0 = ZEXT1632(local_1c0._0_16_);
        local_1e0._0_16_ = ZEXT816(0);
        local_1e0 = ZEXT1632(local_1e0._0_16_);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar23 = piVar22;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar63._0_2_ = (undefined2)iVar37;
          auVar63._2_2_ = auVar63._0_2_;
          auVar63._4_2_ = auVar63._0_2_;
          auVar63._6_2_ = auVar63._0_2_;
          auVar63._8_2_ = auVar63._0_2_;
          auVar63._10_2_ = auVar63._0_2_;
          auVar63._12_2_ = auVar63._0_2_;
          auVar63._14_2_ = auVar63._0_2_;
          auVar63._16_2_ = auVar63._0_2_;
          auVar63._18_2_ = auVar63._0_2_;
          auVar63._20_2_ = auVar63._0_2_;
          auVar63._22_2_ = auVar63._0_2_;
          auVar63._24_2_ = auVar63._0_2_;
          auVar63._26_2_ = auVar63._0_2_;
          auVar63._28_2_ = auVar63._0_2_;
          auVar63._30_2_ = auVar63._0_2_;
          if ((int)uVar21 < 1) {
            uVar31 = 0;
          }
          else {
            pauVar19 = (undefined1 (*) [32])(piVar18 + lVar29);
            uVar31 = 0;
            do {
              auVar68 = vpmullw_avx2(auVar63,*(undefined1 (*) [32])(piVar23 + uVar31));
              lVar30 = 0;
              pauVar20 = pauVar19;
              do {
                auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar30));
                *(undefined1 (*) [32])(local_240 + lVar30) = auVar48;
                lVar30 = lVar30 + 0x20;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
              } while (lVar30 != 0x80);
              uVar31 = uVar31 + 0x10;
              pauVar19 = pauVar19 + 1;
            } while ((long)uVar31 < lVar35);
            uVar31 = uVar31 & 0xffffffff;
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar31));
            auVar68 = vpmullw_avx2(auVar63,auVar68);
            pauVar19 = (undefined1 (*) [32])(piVar18 + uVar31 + lVar29);
            lVar30 = 0;
            do {
              auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
              auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar30));
              *(undefined1 (*) [32])(local_240 + lVar30) = auVar48;
              lVar30 = lVar30 + 0x20;
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
            } while (lVar30 != 0x80);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar24);
          piVar23 = piVar23 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vphaddd_avx2(local_240,local_220);
        auVar48 = vphaddd_avx2(local_200,local_1e0);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        *(undefined1 (*) [32])(H + uVar33 * 0x1a) = auVar68;
        uVar31 = local_290;
        uVar17 = local_278;
        if (uVar33 < 0x14) {
          do {
            local_1c0._0_16_ = ZEXT816(0);
            local_1c0 = ZEXT1632(local_1c0._0_16_);
            local_1e0._0_16_ = ZEXT816(0);
            local_1e0 = ZEXT1632(local_1e0._0_16_);
            local_200._0_16_ = ZEXT816(0);
            local_200 = ZEXT1632(local_200._0_16_);
            local_220._0_16_ = ZEXT816(0);
            local_220 = ZEXT1632(local_220._0_16_);
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar18 = dgd_avg;
            piVar23 = piVar22;
            iVar42 = v_start;
            iVar37 = iVar15;
            do {
              iVar32 = v_end - iVar42;
              if (3 < v_end - iVar42) {
                iVar32 = iVar37;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar32 = iVar37;
              }
              iVar37 = iVar32;
              auVar64._0_2_ = (undefined2)iVar37;
              auVar64._2_2_ = auVar64._0_2_;
              auVar64._4_2_ = auVar64._0_2_;
              auVar64._6_2_ = auVar64._0_2_;
              auVar64._8_2_ = auVar64._0_2_;
              auVar64._10_2_ = auVar64._0_2_;
              auVar64._12_2_ = auVar64._0_2_;
              auVar64._14_2_ = auVar64._0_2_;
              auVar64._16_2_ = auVar64._0_2_;
              auVar64._18_2_ = auVar64._0_2_;
              auVar64._20_2_ = auVar64._0_2_;
              auVar64._22_2_ = auVar64._0_2_;
              auVar64._24_2_ = auVar64._0_2_;
              auVar64._26_2_ = auVar64._0_2_;
              auVar64._28_2_ = auVar64._0_2_;
              auVar64._30_2_ = auVar64._0_2_;
              if ((int)uVar21 < 1) {
                uVar38 = 0;
              }
              else {
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar17);
                uVar38 = 0;
                do {
                  auVar68 = vpmullw_avx2(auVar64,*(undefined1 (*) [32])(piVar23 + uVar38));
                  lVar30 = 0;
                  pauVar20 = pauVar19;
                  do {
                    auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                    auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar30));
                    *(undefined1 (*) [32])(local_240 + lVar30) = auVar48;
                    lVar30 = lVar30 + 0x20;
                    pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                  } while (lVar30 != 0xa0);
                  uVar38 = uVar38 + 0x10;
                  pauVar19 = pauVar19 + 1;
                } while ((long)uVar38 < lVar35);
                uVar38 = uVar38 & 0xffffffff;
              }
              if (uVar41 != 0) {
                auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar38));
                auVar68 = vpmullw_avx2(auVar64,auVar68);
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar38 * 2 + uVar17);
                lVar30 = 0;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar30));
                  *(undefined1 (*) [32])(local_240 + lVar30) = auVar48;
                  lVar30 = lVar30 + 0x20;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
                } while (lVar30 != 0xa0);
              }
              iVar42 = iVar42 + iVar37;
              piVar18 = piVar18 + (int)(iVar37 * uVar24);
              piVar23 = piVar23 + (int)(iVar37 * uVar24);
            } while (iVar42 < v_end);
            auVar68 = vphaddd_avx2(local_240,local_220);
            auVar48 = vphaddd_avx2(local_200,local_1e0);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x19 + uVar31 * 5) = auVar68;
            auVar68 = vpmovsxdq_avx2(local_1c0._0_16_);
            auVar48 = vpmovsxdq_avx2(local_1c0._16_16_);
            auVar68 = vpaddq_avx2(auVar68,auVar48);
            auVar48 = vpshufd_avx2(auVar68,0x44);
            auVar68 = vpshufd_avx2(auVar68,0xee);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            auVar46 = vpaddq_avx(auVar68._0_16_,auVar68._16_16_);
            H[uVar33 * 0x19 + uVar31 * 5 + 4] = auVar46._0_8_;
            bVar43 = uVar31 < 4;
            uVar31 = uVar31 + 1;
            uVar17 = uVar17 + 2;
          } while (bVar43);
        }
        uVar33 = uVar33 + 5;
        local_290 = local_290 + 1;
        local_278 = local_278 + 2;
      } while (local_290 != 6);
      lVar30 = (long)(int)(uVar24 * 2);
      local_290 = 1;
      local_278 = 2;
      uVar33 = 2;
      do {
        piVar18 = dgd_avg + ((uint)uVar33 & 0xff) / 5;
        piVar22 = piVar18 + lVar30;
        local_1c0._0_16_ = ZEXT816(0);
        local_1c0 = ZEXT1632(local_1c0._0_16_);
        local_1e0._0_16_ = ZEXT816(0);
        local_1e0 = ZEXT1632(local_1e0._0_16_);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar23 = piVar22;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar65._0_2_ = (undefined2)iVar37;
          auVar65._2_2_ = auVar65._0_2_;
          auVar65._4_2_ = auVar65._0_2_;
          auVar65._6_2_ = auVar65._0_2_;
          auVar65._8_2_ = auVar65._0_2_;
          auVar65._10_2_ = auVar65._0_2_;
          auVar65._12_2_ = auVar65._0_2_;
          auVar65._14_2_ = auVar65._0_2_;
          auVar65._16_2_ = auVar65._0_2_;
          auVar65._18_2_ = auVar65._0_2_;
          auVar65._20_2_ = auVar65._0_2_;
          auVar65._22_2_ = auVar65._0_2_;
          auVar65._24_2_ = auVar65._0_2_;
          auVar65._26_2_ = auVar65._0_2_;
          auVar65._28_2_ = auVar65._0_2_;
          auVar65._30_2_ = auVar65._0_2_;
          if ((int)uVar21 < 1) {
            uVar31 = 0;
          }
          else {
            pauVar19 = (undefined1 (*) [32])(piVar18 + lVar30);
            uVar31 = 0;
            do {
              auVar68 = vpmullw_avx2(auVar65,*(undefined1 (*) [32])(piVar23 + uVar31));
              lVar39 = 0;
              pauVar20 = pauVar19;
              do {
                auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                lVar39 = lVar39 + 0x20;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
              } while (lVar39 != 0x60);
              uVar31 = uVar31 + 0x10;
              pauVar19 = pauVar19 + 1;
            } while ((long)uVar31 < lVar35);
            uVar31 = uVar31 & 0xffffffff;
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar31));
            auVar68 = vpmullw_avx2(auVar65,auVar68);
            pauVar19 = (undefined1 (*) [32])(piVar18 + uVar31 + lVar30);
            lVar39 = 0;
            do {
              auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
              auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
              *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
              lVar39 = lVar39 + 0x20;
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
            } while (lVar39 != 0x60);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar24);
          piVar23 = piVar23 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vphaddd_avx2(local_240,local_220);
        auVar48 = vphaddd_avx2(local_200,local_1e0);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        *(undefined1 (*) [32])(H + uVar33 * 0x1a) = auVar68;
        uVar31 = local_290;
        uVar17 = local_278;
        if (uVar33 < 0x14) {
          do {
            local_1c0._0_16_ = ZEXT816(0);
            local_1c0 = ZEXT1632(local_1c0._0_16_);
            local_1e0._0_16_ = ZEXT816(0);
            local_1e0 = ZEXT1632(local_1e0._0_16_);
            local_200._0_16_ = ZEXT816(0);
            local_200 = ZEXT1632(local_200._0_16_);
            local_220._0_16_ = ZEXT816(0);
            local_220 = ZEXT1632(local_220._0_16_);
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar23 = piVar22;
            piVar18 = dgd_avg;
            iVar42 = v_start;
            iVar37 = iVar15;
            do {
              iVar32 = v_end - iVar42;
              if (3 < v_end - iVar42) {
                iVar32 = iVar37;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar32 = iVar37;
              }
              iVar37 = iVar32;
              auVar66._0_2_ = (undefined2)iVar37;
              auVar66._2_2_ = auVar66._0_2_;
              auVar66._4_2_ = auVar66._0_2_;
              auVar66._6_2_ = auVar66._0_2_;
              auVar66._8_2_ = auVar66._0_2_;
              auVar66._10_2_ = auVar66._0_2_;
              auVar66._12_2_ = auVar66._0_2_;
              auVar66._14_2_ = auVar66._0_2_;
              auVar66._16_2_ = auVar66._0_2_;
              auVar66._18_2_ = auVar66._0_2_;
              auVar66._20_2_ = auVar66._0_2_;
              auVar66._22_2_ = auVar66._0_2_;
              auVar66._24_2_ = auVar66._0_2_;
              auVar66._26_2_ = auVar66._0_2_;
              auVar66._28_2_ = auVar66._0_2_;
              auVar66._30_2_ = auVar66._0_2_;
              if ((int)uVar21 < 1) {
                uVar38 = 0;
              }
              else {
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar17);
                uVar38 = 0;
                do {
                  auVar68 = vpmullw_avx2(auVar66,*(undefined1 (*) [32])(piVar23 + uVar38));
                  lVar39 = 0;
                  pauVar20 = pauVar19;
                  do {
                    auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                    auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                    *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                    lVar39 = lVar39 + 0x20;
                    pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                  } while (lVar39 != 0xa0);
                  uVar38 = uVar38 + 0x10;
                  pauVar19 = pauVar19 + 1;
                } while ((long)uVar38 < lVar35);
                uVar38 = uVar38 & 0xffffffff;
              }
              if (uVar41 != 0) {
                auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar38));
                auVar68 = vpmullw_avx2(auVar66,auVar68);
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar38 * 2 + uVar17);
                lVar39 = 0;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                  *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                  lVar39 = lVar39 + 0x20;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
                } while (lVar39 != 0xa0);
              }
              iVar42 = iVar42 + iVar37;
              piVar18 = piVar18 + (int)(iVar37 * uVar24);
              piVar23 = piVar23 + (int)(iVar37 * uVar24);
            } while (iVar42 < v_end);
            auVar68 = vphaddd_avx2(local_240,local_220);
            auVar48 = vphaddd_avx2(local_200,local_1e0);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x19 + uVar31 * 5) = auVar68;
            auVar68 = vpmovsxdq_avx2(local_1c0._0_16_);
            auVar48 = vpmovsxdq_avx2(local_1c0._16_16_);
            auVar68 = vpaddq_avx2(auVar68,auVar48);
            auVar48 = vpshufd_avx2(auVar68,0x44);
            auVar68 = vpshufd_avx2(auVar68,0xee);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            auVar46 = vpaddq_avx(auVar68._0_16_,auVar68._16_16_);
            H[uVar33 * 0x19 + uVar31 * 5 + 4] = auVar46._0_8_;
            bVar43 = uVar31 < 4;
            uVar31 = uVar31 + 1;
            uVar17 = uVar17 + 2;
          } while (bVar43);
        }
        uVar33 = uVar33 + 5;
        local_290 = local_290 + 1;
        local_278 = local_278 + 2;
      } while (local_290 != 6);
      lVar30 = (long)(int)(uVar24 * 3);
      local_278 = 1;
      uVar33 = 3;
      local_248 = 2;
      do {
        piVar18 = dgd_avg + ((uint)uVar33 & 0xff) / 5;
        piVar22 = piVar18 + lVar30;
        auVar49 = ZEXT1664((undefined1  [16])0x0);
        auVar76 = ZEXT1664((undefined1  [16])0x0);
        piVar23 = piVar22;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar78._0_2_ = (undefined2)iVar37;
          auVar78._2_2_ = auVar78._0_2_;
          auVar78._4_2_ = auVar78._0_2_;
          auVar78._6_2_ = auVar78._0_2_;
          auVar78._8_2_ = auVar78._0_2_;
          auVar78._10_2_ = auVar78._0_2_;
          auVar78._12_2_ = auVar78._0_2_;
          auVar78._14_2_ = auVar78._0_2_;
          auVar78._16_2_ = auVar78._0_2_;
          auVar78._18_2_ = auVar78._0_2_;
          auVar78._20_2_ = auVar78._0_2_;
          auVar78._22_2_ = auVar78._0_2_;
          auVar78._24_2_ = auVar78._0_2_;
          auVar78._26_2_ = auVar78._0_2_;
          auVar78._28_2_ = auVar78._0_2_;
          auVar78._30_2_ = auVar78._0_2_;
          if ((int)uVar21 < 1) {
            lVar39 = 0;
          }
          else {
            lVar39 = 0;
            do {
              auVar48 = vpmullw_avx2(auVar78,*(undefined1 (*) [32])(piVar23 + lVar39));
              auVar68 = vpmaddwd_avx2(auVar48,*(undefined1 (*) [32])(piVar18 + lVar30 + lVar39));
              auVar48 = vpmaddwd_avx2(auVar48,*(undefined1 (*) [32])
                                               (piVar18 + lVar30 + lVar29 + lVar39));
              auVar68 = vpaddd_avx2(auVar68,auVar76._0_32_);
              auVar76 = ZEXT3264(auVar68);
              auVar68 = vpaddd_avx2(auVar48,auVar49._0_32_);
              auVar49 = ZEXT3264(auVar68);
              lVar39 = lVar39 + 0x10;
            } while (lVar39 < lVar35);
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + lVar39));
            auVar48 = vpmullw_avx2(auVar78,auVar68);
            auVar68 = vpmaddwd_avx2(auVar48,*(undefined1 (*) [32])(piVar18 + lVar39 + lVar30));
            auVar68 = vpaddd_avx2(auVar68,auVar76._0_32_);
            auVar76 = ZEXT3264(auVar68);
            auVar68 = vpmaddwd_avx2(auVar48,*(undefined1 (*) [32])
                                             (*(undefined1 (*) [32])(piVar18 + lVar39 + lVar30) +
                                             lVar29 * 2));
            auVar68 = vpaddd_avx2(auVar68,auVar49._0_32_);
            auVar49 = ZEXT3264(auVar68);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar24);
          piVar23 = piVar23 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vpmovsxdq_avx2(auVar76._0_16_);
        auVar48 = vpmovsxdq_avx2(auVar76._16_16_);
        auVar68 = vpaddq_avx2(auVar68,auVar48);
        auVar48 = vpmovsxdq_avx2(auVar49._0_16_);
        auVar47 = vpmovsxdq_avx2(auVar49._16_16_);
        auVar48 = vpaddq_avx2(auVar48,auVar47);
        auVar47 = vpunpcklqdq_avx2(auVar68,auVar48);
        auVar68 = vpunpckhqdq_avx2(auVar68,auVar48);
        auVar68 = vpaddq_avx2(auVar47,auVar68);
        auVar46 = vpaddq_avx(auVar68._0_16_,auVar68._16_16_);
        *(undefined1 (*) [16])(H + uVar33 * 0x1a) = auVar46;
        uVar31 = local_278;
        lVar39 = local_248;
        if (uVar33 < 0x14) {
          do {
            local_1c0._0_16_ = ZEXT816(0);
            local_1c0 = ZEXT1632(local_1c0._0_16_);
            local_1e0._0_16_ = ZEXT816(0);
            local_1e0 = ZEXT1632(local_1e0._0_16_);
            local_200._0_16_ = ZEXT816(0);
            local_200 = ZEXT1632(local_200._0_16_);
            local_220._0_16_ = ZEXT816(0);
            local_220 = ZEXT1632(local_220._0_16_);
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar23 = piVar22;
            piVar18 = dgd_avg;
            iVar42 = v_start;
            iVar37 = iVar15;
            do {
              iVar32 = v_end - iVar42;
              if (3 < v_end - iVar42) {
                iVar32 = iVar37;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar32 = iVar37;
              }
              iVar37 = iVar32;
              auVar67._0_2_ = (undefined2)iVar37;
              auVar67._2_2_ = auVar67._0_2_;
              auVar67._4_2_ = auVar67._0_2_;
              auVar67._6_2_ = auVar67._0_2_;
              auVar67._8_2_ = auVar67._0_2_;
              auVar67._10_2_ = auVar67._0_2_;
              auVar67._12_2_ = auVar67._0_2_;
              auVar67._14_2_ = auVar67._0_2_;
              auVar67._16_2_ = auVar67._0_2_;
              auVar67._18_2_ = auVar67._0_2_;
              auVar67._20_2_ = auVar67._0_2_;
              auVar67._22_2_ = auVar67._0_2_;
              auVar67._24_2_ = auVar67._0_2_;
              auVar67._26_2_ = auVar67._0_2_;
              auVar67._28_2_ = auVar67._0_2_;
              auVar67._30_2_ = auVar67._0_2_;
              if ((int)uVar21 < 1) {
                uVar17 = 0;
              }
              else {
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + lVar39);
                uVar17 = 0;
                do {
                  auVar68 = vpmullw_avx2(auVar67,*(undefined1 (*) [32])(piVar23 + uVar17));
                  lVar25 = 0;
                  pauVar20 = pauVar19;
                  do {
                    auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                    auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar25));
                    *(undefined1 (*) [32])(local_240 + lVar25) = auVar48;
                    lVar25 = lVar25 + 0x20;
                    pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                  } while (lVar25 != 0xa0);
                  uVar17 = uVar17 + 0x10;
                  pauVar19 = pauVar19 + 1;
                } while ((long)uVar17 < lVar35);
                uVar17 = uVar17 & 0xffffffff;
              }
              if (uVar41 != 0) {
                auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar17));
                auVar68 = vpmullw_avx2(auVar67,auVar68);
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar17 * 2 + lVar39);
                lVar25 = 0;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar25));
                  *(undefined1 (*) [32])(local_240 + lVar25) = auVar48;
                  lVar25 = lVar25 + 0x20;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
                } while (lVar25 != 0xa0);
              }
              iVar42 = iVar42 + iVar37;
              piVar18 = piVar18 + (int)(iVar37 * uVar24);
              piVar23 = piVar23 + (int)(iVar37 * uVar24);
            } while (iVar42 < v_end);
            auVar68 = vphaddd_avx2(local_240,local_220);
            auVar48 = vphaddd_avx2(local_200,local_1e0);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x19 + uVar31 * 5) = auVar68;
            auVar68 = vpmovsxdq_avx2(local_1c0._0_16_);
            auVar48 = vpmovsxdq_avx2(local_1c0._16_16_);
            auVar68 = vpaddq_avx2(auVar68,auVar48);
            auVar48 = vpshufd_avx2(auVar68,0x44);
            auVar68 = vpshufd_avx2(auVar68,0xee);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            auVar46 = vpaddq_avx(auVar68._0_16_,auVar68._16_16_);
            H[uVar33 * 0x19 + uVar31 * 5 + 4] = auVar46._0_8_;
            bVar43 = uVar31 < 4;
            uVar31 = uVar31 + 1;
            lVar39 = lVar39 + 2;
          } while (bVar43);
        }
        uVar33 = uVar33 + 5;
        local_278 = local_278 + 1;
        local_248 = local_248 + 2;
      } while (local_278 != 6);
      lVar29 = (long)(int)(uVar24 * 4);
      local_288 = 1;
      uVar33 = 4;
      local_290 = 2;
      do {
        piVar18 = dgd_avg + ((uint)uVar33 & 0xff) / 5;
        piVar22 = piVar18 + lVar29;
        auVar49 = ZEXT1664((undefined1  [16])0x0);
        piVar23 = piVar22;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar74._0_2_ = (undefined2)iVar37;
          auVar74._2_2_ = auVar74._0_2_;
          auVar74._4_2_ = auVar74._0_2_;
          auVar74._6_2_ = auVar74._0_2_;
          auVar74._8_2_ = auVar74._0_2_;
          auVar74._10_2_ = auVar74._0_2_;
          auVar74._12_2_ = auVar74._0_2_;
          auVar74._14_2_ = auVar74._0_2_;
          auVar74._16_2_ = auVar74._0_2_;
          auVar74._18_2_ = auVar74._0_2_;
          auVar74._20_2_ = auVar74._0_2_;
          auVar74._22_2_ = auVar74._0_2_;
          auVar74._24_2_ = auVar74._0_2_;
          auVar74._26_2_ = auVar74._0_2_;
          auVar74._28_2_ = auVar74._0_2_;
          auVar74._30_2_ = auVar74._0_2_;
          if ((int)uVar21 < 1) {
            lVar30 = 0;
          }
          else {
            lVar30 = 0;
            do {
              auVar68 = vpmullw_avx2(auVar74,*(undefined1 (*) [32])(piVar23 + lVar30));
              auVar68 = vpmaddwd_avx2(auVar68,*(undefined1 (*) [32])(piVar18 + lVar29 + lVar30));
              auVar68 = vpaddd_avx2(auVar68,auVar49._0_32_);
              auVar49 = ZEXT3264(auVar68);
              lVar30 = lVar30 + 0x10;
            } while (lVar30 < lVar35);
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + lVar30));
            auVar68 = vpmullw_avx2(auVar74,auVar68);
            auVar68 = vpmaddwd_avx2(auVar68,*(undefined1 (*) [32])(piVar18 + lVar30 + lVar29));
            auVar68 = vpaddd_avx2(auVar68,auVar49._0_32_);
            auVar49 = ZEXT3264(auVar68);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar24);
          piVar23 = piVar23 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vpmovsxdq_avx2(auVar49._0_16_);
        auVar48 = vpmovsxdq_avx2(auVar49._16_16_);
        auVar68 = vpaddq_avx2(auVar68,auVar48);
        auVar47 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar48 = vpblendd_avx2(auVar68,auVar47,0xcc);
        auVar68 = vpsrldq_avx2(auVar68,8);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        auVar46 = vpaddq_avx(auVar68._0_16_,auVar68._16_16_);
        *(undefined1 (*) [16])(H + uVar33 * 0x1a) = auVar46;
        uVar31 = local_288;
        uVar17 = local_290;
        if (uVar33 < 0x14) {
          do {
            local_1c0 = auVar47;
            local_1e0 = auVar47;
            local_200 = auVar47;
            local_220 = auVar47;
            local_240 = auVar47;
            piVar18 = dgd_avg;
            piVar23 = piVar22;
            iVar42 = v_start;
            iVar37 = iVar15;
            do {
              iVar32 = v_end - iVar42;
              if (3 < v_end - iVar42) {
                iVar32 = iVar37;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar32 = iVar37;
              }
              iVar37 = iVar32;
              auVar69._0_2_ = (undefined2)iVar37;
              auVar69._2_2_ = auVar69._0_2_;
              auVar69._4_2_ = auVar69._0_2_;
              auVar69._6_2_ = auVar69._0_2_;
              auVar69._8_2_ = auVar69._0_2_;
              auVar69._10_2_ = auVar69._0_2_;
              auVar69._12_2_ = auVar69._0_2_;
              auVar69._14_2_ = auVar69._0_2_;
              auVar69._16_2_ = auVar69._0_2_;
              auVar69._18_2_ = auVar69._0_2_;
              auVar69._20_2_ = auVar69._0_2_;
              auVar69._22_2_ = auVar69._0_2_;
              auVar69._24_2_ = auVar69._0_2_;
              auVar69._26_2_ = auVar69._0_2_;
              auVar69._28_2_ = auVar69._0_2_;
              auVar69._30_2_ = auVar69._0_2_;
              if ((int)uVar21 < 1) {
                uVar38 = 0;
              }
              else {
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar17);
                uVar38 = 0;
                do {
                  auVar68 = vpmullw_avx2(auVar69,*(undefined1 (*) [32])(piVar23 + uVar38));
                  lVar30 = 0;
                  pauVar20 = pauVar19;
                  do {
                    auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                    auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar30));
                    *(undefined1 (*) [32])(local_240 + lVar30) = auVar48;
                    lVar30 = lVar30 + 0x20;
                    pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                  } while (lVar30 != 0xa0);
                  uVar38 = uVar38 + 0x10;
                  pauVar19 = pauVar19 + 1;
                } while ((long)uVar38 < lVar35);
                uVar38 = uVar38 & 0xffffffff;
              }
              if (uVar41 != 0) {
                auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar38));
                auVar68 = vpmullw_avx2(auVar69,auVar68);
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar38 * 2 + uVar17);
                lVar30 = 0;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar30));
                  *(undefined1 (*) [32])(local_240 + lVar30) = auVar48;
                  lVar30 = lVar30 + 0x20;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
                } while (lVar30 != 0xa0);
              }
              iVar42 = iVar42 + iVar37;
              piVar18 = piVar18 + (int)(iVar37 * uVar24);
              piVar23 = piVar23 + (int)(iVar37 * uVar24);
            } while (iVar42 < v_end);
            auVar68 = vphaddd_avx2(local_240,local_220);
            auVar48 = vphaddd_avx2(local_200,local_1e0);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x19 + uVar31 * 5) = auVar68;
            auVar68 = vpmovsxdq_avx2(local_1c0._0_16_);
            auVar48 = vpmovsxdq_avx2(local_1c0._16_16_);
            auVar68 = vpaddq_avx2(auVar68,auVar48);
            auVar48 = vpshufd_avx2(auVar68,0x44);
            auVar68 = vpshufd_avx2(auVar68,0xee);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            auVar46 = vpaddq_avx(auVar68._0_16_,auVar68._16_16_);
            H[uVar33 * 0x19 + uVar31 * 5 + 4] = auVar46._0_8_;
            bVar43 = uVar31 < 4;
            uVar31 = uVar31 + 1;
            uVar17 = uVar17 + 2;
          } while (bVar43);
        }
        uVar33 = uVar33 + 5;
        local_288 = local_288 + 1;
        local_290 = local_290 + 2;
      } while (local_288 != 6);
      lVar29 = 1;
      local_280 = 4;
      lVar30 = 5;
      do {
        lVar40 = 0;
        lVar25 = 0;
        lVar39 = lVar29;
        do {
          local_1c0._0_16_ = ZEXT816(0);
          local_1c0 = ZEXT1632(local_1c0._0_16_);
          local_1e0._0_16_ = ZEXT816(0);
          local_1e0 = ZEXT1632(local_1e0._0_16_);
          local_200._0_16_ = ZEXT816(0);
          local_200 = ZEXT1632(local_200._0_16_);
          local_220._0_16_ = ZEXT816(0);
          local_220 = ZEXT1632(local_220._0_16_);
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          piVar18 = dgd_avg + ((uint)lVar30 & 0xff) / 5;
          piVar22 = dgd_avg + ((uint)lVar30 & 0xff) / 5;
          iVar42 = v_start;
          iVar37 = iVar15;
          do {
            iVar32 = v_end - iVar42;
            if (3 < v_end - iVar42) {
              iVar32 = iVar37;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar32 = iVar37;
            }
            iVar37 = iVar32;
            auVar70._0_2_ = (undefined2)iVar37;
            auVar70._2_2_ = auVar70._0_2_;
            auVar70._4_2_ = auVar70._0_2_;
            auVar70._6_2_ = auVar70._0_2_;
            auVar70._8_2_ = auVar70._0_2_;
            auVar70._10_2_ = auVar70._0_2_;
            auVar70._12_2_ = auVar70._0_2_;
            auVar70._14_2_ = auVar70._0_2_;
            auVar70._16_2_ = auVar70._0_2_;
            auVar70._18_2_ = auVar70._0_2_;
            auVar70._20_2_ = auVar70._0_2_;
            auVar70._22_2_ = auVar70._0_2_;
            auVar70._24_2_ = auVar70._0_2_;
            auVar70._26_2_ = auVar70._0_2_;
            auVar70._28_2_ = auVar70._0_2_;
            auVar70._30_2_ = auVar70._0_2_;
            if ((int)uVar21 < 1) {
              uVar33 = 0;
            }
            else {
              pauVar19 = (undefined1 (*) [32])((long)piVar18 + lVar40);
              uVar33 = 0;
              do {
                auVar68 = vpmullw_avx2(auVar70,*(undefined1 (*) [32])(piVar22 + uVar33));
                lVar26 = 0;
                pauVar20 = pauVar19;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar26));
                  *(undefined1 (*) [32])(local_240 + lVar26) = auVar48;
                  lVar26 = lVar26 + 0x20;
                  pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                } while (lVar26 != 0xa0);
                uVar33 = uVar33 + 0x10;
                pauVar19 = pauVar19 + 1;
              } while ((long)uVar33 < lVar35);
              uVar33 = uVar33 & 0xffffffff;
            }
            if (uVar41 != 0) {
              auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar22 + uVar33));
              auVar68 = vpmullw_avx2(auVar70,auVar68);
              pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar33 * 2 + lVar40);
              lVar26 = 0;
              do {
                auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar26));
                *(undefined1 (*) [32])(local_240 + lVar26) = auVar48;
                lVar26 = lVar26 + 0x20;
                pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
              } while (lVar26 != 0xa0);
            }
            iVar42 = iVar42 + iVar37;
            piVar18 = piVar18 + (int)(iVar37 * uVar24);
            piVar22 = piVar22 + (int)(iVar37 * uVar24);
          } while (iVar42 < v_end);
          auVar68 = vphaddd_avx2(local_240,local_220);
          auVar48 = vphaddd_avx2(local_200,local_1e0);
          auVar68 = vphaddd_avx2(auVar68,auVar48);
          auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
          auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
          auVar68 = vpaddq_avx2(auVar48,auVar68);
          *(undefined1 (*) [32])(H + lVar30 * 0x19 + lVar39 * 5) = auVar68;
          auVar68 = vpmovsxdq_avx2(local_1c0._0_16_);
          auVar48 = vpmovsxdq_avx2(local_1c0._16_16_);
          auVar68 = vpaddq_avx2(auVar68,auVar48);
          auVar48 = vpshufd_avx2(auVar68,0x44);
          auVar68 = vpshufd_avx2(auVar68,0xee);
          auVar68 = vpaddq_avx2(auVar48,auVar68);
          auVar46 = vpaddq_avx(auVar68._0_16_,auVar68._16_16_);
          H[lVar30 * 0x19 + lVar39 * 5 + 4] = auVar46._0_8_;
          lVar25 = lVar25 + 1;
          lVar39 = lVar39 + 1;
          lVar40 = lVar40 + 2;
        } while (lVar25 != local_280);
        lVar30 = lVar30 + 5;
        lVar29 = lVar29 + 1;
        local_280 = local_280 + -1;
      } while (lVar29 != 5);
      pauVar20 = (undefined1 (*) [32])(H + 0x7d);
      pauVar19 = (undefined1 (*) [32])(H + 5);
      uVar33 = 1;
      uVar31 = 0;
      while( true ) {
        auVar45 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(H + uVar31 * 0x1a + 1),
                                   *(undefined1 (*) [32])(H + uVar31 * 0x1a + 0x1a));
        auVar68 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(H + uVar31 * 0x1a + 0x33),
                                   *(undefined1 (*) [32])(H + uVar31 * 0x1a + 0x4c));
        auVar48 = vperm2i128_avx2(auVar45,auVar68,0x31);
        auVar45 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(H + uVar31 * 0x1a + 1),
                                   *(undefined1 (*) [32])(H + uVar31 * 0x1a + 0x1a));
        auVar68 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(H + uVar31 * 0x1a + 0x33),
                                   *(undefined1 (*) [32])(H + uVar31 * 0x1a + 0x4c));
        auVar68 = vperm2i128_avx2(auVar45,auVar68,0x31);
        H[uVar31 * 0x1a + 0x19] = H[uVar31 * 0x1a + 1];
        *(undefined1 (*) [16])(H + uVar31 * 0x1a + 0x32) = auVar45._0_16_;
        *(undefined1 (*) [32])(H + uVar31 * 0x1a + 0x4b) = auVar48;
        *(undefined1 (*) [32])(H + uVar31 * 0x1a + 100) = auVar68;
        if (0x13 < uVar31) break;
        uVar31 = uVar31 + 4;
        pauVar27 = pauVar20;
        pauVar36 = pauVar19;
        uVar17 = uVar33;
        do {
          auVar48 = vpunpcklqdq_avx2(*pauVar36,*(undefined1 (*) [32])(pauVar36[6] + 8));
          auVar47 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(pauVar36[0xc] + 0x10),
                                     *(undefined1 (*) [32])(pauVar36[0x12] + 0x18));
          auVar45 = vpunpckhqdq_avx2(*pauVar36,*(undefined1 (*) [32])(pauVar36[6] + 8));
          auVar68 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(pauVar36[0xc] + 0x10),
                                     *(undefined1 (*) [32])(pauVar36[0x12] + 0x18));
          auVar71._0_16_ = ZEXT116(0) * auVar47._0_16_ + ZEXT116(1) * auVar48._0_16_;
          auVar71._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar47._0_16_;
          auVar75._0_16_ = ZEXT116(0) * auVar68._0_16_ + ZEXT116(1) * auVar45._0_16_;
          auVar75._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar68._0_16_;
          auVar48 = vperm2i128_avx2(auVar48,auVar47,0x31);
          auVar45 = vperm2i128_avx2(auVar45,auVar68,0x31);
          *pauVar27 = auVar71;
          *(undefined1 (*) [32])(pauVar27[6] + 8) = auVar75;
          *(undefined1 (*) [32])(pauVar27[0xc] + 0x10) = auVar48;
          *(undefined1 (*) [32])(pauVar27[0x12] + 0x18) = auVar45;
          uVar17 = uVar17 + 4;
          pauVar27 = pauVar27 + 0x19;
          pauVar36 = pauVar36 + 1;
        } while (uVar17 < 0x15);
        uVar33 = uVar33 + 4;
        pauVar20 = pauVar20 + 0x1a;
        pauVar19 = pauVar19 + 0x1a;
      }
    }
    else if (wiener_win == 7) {
      uVar21 = uVar41 & 0xfffffff0;
      uVar41 = uVar41 & 0xf;
      auVar45 = *(undefined1 (*) [32])(mask_16bit + (0x10 - uVar41));
      lVar35 = (long)(int)uVar21;
      local_280 = 0;
      lVar30 = 0;
      do {
        local_180._0_16_ = ZEXT816(0);
        local_180 = ZEXT1632(local_180._0_16_);
        local_1a0._0_16_ = ZEXT816(0);
        local_1a0 = ZEXT1632(local_1a0._0_16_);
        local_1c0._0_16_ = ZEXT816(0);
        local_1c0 = ZEXT1632(local_1c0._0_16_);
        local_1e0._0_16_ = ZEXT816(0);
        local_1e0 = ZEXT1632(local_1e0._0_16_);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_80 = 0;
        uStack_78 = 0;
        uStack_70 = 0;
        uStack_68 = 0;
        local_a0 = 0;
        uStack_98 = 0;
        uStack_90 = 0;
        uStack_88 = 0;
        local_c0 = 0;
        uStack_b8 = 0;
        uStack_b0 = 0;
        uStack_a8 = 0;
        local_e0 = 0;
        uStack_d8 = 0;
        uStack_d0 = 0;
        uStack_c8 = 0;
        local_100 = 0;
        uStack_f8 = 0;
        uStack_f0 = 0;
        uStack_e8 = 0;
        local_120 = 0;
        uStack_118 = 0;
        uStack_110 = 0;
        uStack_108 = 0;
        local_140 = 0;
        uStack_138 = 0;
        uStack_130 = 0;
        uStack_128 = 0;
        piVar22 = dgd_avg;
        piVar18 = src_avg;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar50._0_2_ = (undefined2)iVar37;
          auVar50._2_2_ = auVar50._0_2_;
          auVar50._4_2_ = auVar50._0_2_;
          auVar50._6_2_ = auVar50._0_2_;
          auVar50._8_2_ = auVar50._0_2_;
          auVar50._10_2_ = auVar50._0_2_;
          auVar50._12_2_ = auVar50._0_2_;
          auVar50._14_2_ = auVar50._0_2_;
          auVar50._16_2_ = auVar50._0_2_;
          auVar50._18_2_ = auVar50._0_2_;
          auVar50._20_2_ = auVar50._0_2_;
          auVar50._22_2_ = auVar50._0_2_;
          auVar50._24_2_ = auVar50._0_2_;
          auVar50._26_2_ = auVar50._0_2_;
          auVar50._28_2_ = auVar50._0_2_;
          auVar50._30_2_ = auVar50._0_2_;
          if ((int)uVar21 < 1) {
            uVar33 = 0;
          }
          else {
            pauVar19 = (undefined1 (*) [32])((long)piVar22 + local_280);
            uVar33 = 0;
            do {
              auVar68 = vpmullw_avx2(auVar50,*(undefined1 (*) [32])(piVar18 + uVar33));
              auVar48 = vpmullw_avx2(auVar50,*(undefined1 (*) [32])(piVar22 + uVar33));
              lVar39 = 0;
              pauVar20 = pauVar19;
              do {
                auVar47 = *pauVar20;
                auVar3 = vpmaddwd_avx2(auVar68,auVar47);
                auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])(local_240 + lVar39));
                *(undefined1 (*) [32])(local_240 + lVar39) = auVar3;
                auVar47 = vpmaddwd_avx2(auVar48,auVar47);
                auVar47 = vpaddd_avx2(auVar47,*(undefined1 (*) [32])((long)&local_140 + lVar39));
                *(undefined1 (*) [32])((long)&local_140 + lVar39) = auVar47;
                lVar39 = lVar39 + 0x20;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
              } while (lVar39 != 0xe0);
              uVar33 = uVar33 + 0x10;
              pauVar19 = pauVar19 + 1;
            } while ((long)uVar33 < lVar35);
            uVar33 = uVar33 & 0xffffffff;
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar18 + uVar33));
            auVar48 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar22 + uVar33));
            auVar68 = vpmullw_avx2(auVar50,auVar68);
            auVar48 = vpmullw_avx2(auVar50,auVar48);
            pauVar19 = (undefined1 (*) [32])(*(undefined1 (*) [32])(piVar22 + uVar33) + local_280);
            lVar39 = 0;
            do {
              auVar47 = *pauVar19;
              auVar3 = vpmaddwd_avx2(auVar68,auVar47);
              auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])(local_240 + lVar39));
              *(undefined1 (*) [32])(local_240 + lVar39) = auVar3;
              auVar47 = vpmaddwd_avx2(auVar48,auVar47);
              auVar47 = vpaddd_avx2(auVar47,*(undefined1 (*) [32])((long)&local_140 + lVar39));
              *(undefined1 (*) [32])((long)&local_140 + lVar39) = auVar47;
              lVar39 = lVar39 + 0x20;
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
            } while (lVar39 != 0xe0);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar28);
          piVar22 = piVar22 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vphaddd_avx2(local_240,local_220);
        auVar48 = vphaddd_avx2(local_200,local_1e0);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar47 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar48 = vphaddd_avx2(local_1c0,local_1a0);
        auVar68 = vpaddq_avx2(auVar47,auVar68);
        auVar47 = vphaddd_avx2(local_180,local_180);
        auVar48 = vphaddd_avx2(auVar48,auVar47);
        auVar47 = vpmovsxdq_avx2(auVar48._0_16_);
        auVar48 = vpmovsxdq_avx2(auVar48._16_16_);
        auVar48 = vpaddq_avx2(auVar47,auVar48);
        *(undefined1 (*) [32])(M + lVar30 * 7) = auVar68;
        *(undefined1 (*) [16])(M + lVar30 * 7 + 4) = auVar48._0_16_;
        M[lVar30 * 7 + 6] = auVar48._16_8_;
        auVar6._8_8_ = uStack_138;
        auVar6._0_8_ = local_140;
        auVar6._16_8_ = uStack_130;
        auVar6._24_8_ = uStack_128;
        auVar8._8_8_ = uStack_f8;
        auVar8._0_8_ = local_100;
        auVar8._16_8_ = uStack_f0;
        auVar8._24_8_ = uStack_e8;
        auVar11._8_8_ = uStack_b8;
        auVar11._0_8_ = local_c0;
        auVar11._16_8_ = uStack_b0;
        auVar11._24_8_ = uStack_a8;
        auVar13._8_8_ = uStack_78;
        auVar13._0_8_ = local_80;
        auVar13._16_8_ = uStack_70;
        auVar13._24_8_ = uStack_68;
        auVar7._8_8_ = uStack_118;
        auVar7._0_8_ = local_120;
        auVar7._16_8_ = uStack_110;
        auVar7._24_8_ = uStack_108;
        auVar68 = vphaddd_avx2(auVar6,auVar7);
        auVar9._8_8_ = uStack_d8;
        auVar9._0_8_ = local_e0;
        auVar9._16_8_ = uStack_d0;
        auVar9._24_8_ = uStack_c8;
        auVar48 = vphaddd_avx2(auVar8,auVar9);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar3 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar12._8_8_ = uStack_98;
        auVar12._0_8_ = local_a0;
        auVar12._16_8_ = uStack_90;
        auVar12._24_8_ = uStack_88;
        auVar48 = vphaddd_avx2(auVar11,auVar12);
        auVar47 = vphaddd_avx2(auVar13,auVar13);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar48 = vphaddd_avx2(auVar48,auVar47);
        auVar68 = vpaddq_avx2(auVar3,auVar68);
        auVar47 = vpmovsxdq_avx2(auVar48._0_16_);
        auVar48 = vpmovsxdq_avx2(auVar48._16_16_);
        auVar48 = vpaddq_avx2(auVar47,auVar48);
        *(undefined1 (*) [32])(H + lVar30 * 7) = auVar68;
        *(undefined1 (*) [16])(H + lVar30 * 7 + 4) = auVar48._0_16_;
        H[lVar30 * 7 + 6] = auVar48._16_8_;
        lVar30 = lVar30 + 1;
        local_280 = local_280 + 2;
      } while (lVar30 != 7);
      uVar33 = 1;
      local_278 = 2;
      local_290 = 1;
      do {
        cVar14 = (char)(((uint)uVar33 & 0xff) * 0x25 >> 8);
        piVar18 = dgd_avg + ((byte)(((byte)((char)uVar33 - cVar14) >> 1) + cVar14) >> 2);
        piVar22 = piVar18 + lVar29;
        local_180._0_16_ = ZEXT816(0);
        local_180 = ZEXT1632(local_180._0_16_);
        local_1a0._0_16_ = ZEXT816(0);
        local_1a0 = ZEXT1632(local_1a0._0_16_);
        local_1c0._0_16_ = ZEXT816(0);
        local_1c0 = ZEXT1632(local_1c0._0_16_);
        local_1e0._0_16_ = ZEXT816(0);
        local_1e0 = ZEXT1632(local_1e0._0_16_);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar23 = piVar22;
        iVar37 = iVar15;
        iVar42 = v_start;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar51._0_2_ = (undefined2)iVar37;
          auVar51._2_2_ = auVar51._0_2_;
          auVar51._4_2_ = auVar51._0_2_;
          auVar51._6_2_ = auVar51._0_2_;
          auVar51._8_2_ = auVar51._0_2_;
          auVar51._10_2_ = auVar51._0_2_;
          auVar51._12_2_ = auVar51._0_2_;
          auVar51._14_2_ = auVar51._0_2_;
          auVar51._16_2_ = auVar51._0_2_;
          auVar51._18_2_ = auVar51._0_2_;
          auVar51._20_2_ = auVar51._0_2_;
          auVar51._22_2_ = auVar51._0_2_;
          auVar51._24_2_ = auVar51._0_2_;
          auVar51._26_2_ = auVar51._0_2_;
          auVar51._28_2_ = auVar51._0_2_;
          auVar51._30_2_ = auVar51._0_2_;
          if ((int)uVar21 < 1) {
            uVar31 = 0;
          }
          else {
            pauVar19 = (undefined1 (*) [32])(piVar18 + lVar29);
            uVar31 = 0;
            do {
              auVar68 = vpmullw_avx2(auVar51,*(undefined1 (*) [32])(piVar23 + uVar31));
              lVar30 = 0;
              pauVar20 = pauVar19;
              do {
                auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar30));
                *(undefined1 (*) [32])(local_240 + lVar30) = auVar48;
                lVar30 = lVar30 + 0x20;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
              } while (lVar30 != 0xc0);
              uVar31 = uVar31 + 0x10;
              pauVar19 = pauVar19 + 1;
            } while ((long)uVar31 < lVar35);
            uVar31 = uVar31 & 0xffffffff;
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar31));
            auVar68 = vpmullw_avx2(auVar51,auVar68);
            pauVar19 = (undefined1 (*) [32])(piVar18 + uVar31 + lVar29);
            lVar30 = 0;
            do {
              auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
              auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar30));
              *(undefined1 (*) [32])(local_240 + lVar30) = auVar48;
              lVar30 = lVar30 + 0x20;
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
            } while (lVar30 != 0xc0);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar24);
          piVar23 = piVar23 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vphaddd_avx2(local_240,local_220);
        auVar48 = vphaddd_avx2(local_200,local_1e0);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        *(undefined1 (*) [32])(H + uVar33 * 0x32) = auVar68;
        auVar68 = vpmovsxdq_avx2(local_1c0._0_16_);
        auVar48 = vpmovsxdq_avx2(local_1c0._16_16_);
        auVar68 = vpaddq_avx2(auVar68,auVar48);
        auVar48 = vpmovsxdq_avx2(local_1a0._0_16_);
        auVar47 = vpmovsxdq_avx2(local_1a0._16_16_);
        auVar48 = vpaddq_avx2(auVar48,auVar47);
        auVar47 = vpunpcklqdq_avx2(auVar68,auVar48);
        auVar68 = vpunpckhqdq_avx2(auVar68,auVar48);
        auVar68 = vpaddq_avx2(auVar47,auVar68);
        auVar46 = vpaddq_avx(auVar68._0_16_,auVar68._16_16_);
        *(undefined1 (*) [16])(H + uVar33 * 0x32 + 4) = auVar46;
        uVar31 = local_278;
        uVar17 = local_290;
        if (uVar33 < 0x2a) {
          do {
            local_180._0_16_ = ZEXT816(0);
            local_180 = ZEXT1632(local_180._0_16_);
            local_1a0._0_16_ = ZEXT816(0);
            local_1a0 = ZEXT1632(local_1a0._0_16_);
            local_1c0._0_16_ = ZEXT816(0);
            local_1c0 = ZEXT1632(local_1c0._0_16_);
            local_1e0._0_16_ = ZEXT816(0);
            local_1e0 = ZEXT1632(local_1e0._0_16_);
            local_200._0_16_ = ZEXT816(0);
            local_200 = ZEXT1632(local_200._0_16_);
            local_220._0_16_ = ZEXT816(0);
            local_220 = ZEXT1632(local_220._0_16_);
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar18 = dgd_avg;
            piVar23 = piVar22;
            iVar42 = v_start;
            iVar37 = iVar15;
            do {
              iVar32 = v_end - iVar42;
              if (3 < v_end - iVar42) {
                iVar32 = iVar37;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar32 = iVar37;
              }
              iVar37 = iVar32;
              auVar52._0_2_ = (undefined2)iVar37;
              auVar52._2_2_ = auVar52._0_2_;
              auVar52._4_2_ = auVar52._0_2_;
              auVar52._6_2_ = auVar52._0_2_;
              auVar52._8_2_ = auVar52._0_2_;
              auVar52._10_2_ = auVar52._0_2_;
              auVar52._12_2_ = auVar52._0_2_;
              auVar52._14_2_ = auVar52._0_2_;
              auVar52._16_2_ = auVar52._0_2_;
              auVar52._18_2_ = auVar52._0_2_;
              auVar52._20_2_ = auVar52._0_2_;
              auVar52._22_2_ = auVar52._0_2_;
              auVar52._24_2_ = auVar52._0_2_;
              auVar52._26_2_ = auVar52._0_2_;
              auVar52._28_2_ = auVar52._0_2_;
              auVar52._30_2_ = auVar52._0_2_;
              if ((int)uVar21 < 1) {
                uVar38 = 0;
              }
              else {
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar31);
                uVar38 = 0;
                do {
                  auVar68 = vpmullw_avx2(auVar52,*(undefined1 (*) [32])(piVar23 + uVar38));
                  lVar30 = 0;
                  pauVar20 = pauVar19;
                  do {
                    auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                    auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar30));
                    *(undefined1 (*) [32])(local_240 + lVar30) = auVar48;
                    lVar30 = lVar30 + 0x20;
                    pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                  } while (lVar30 != 0xe0);
                  uVar38 = uVar38 + 0x10;
                  pauVar19 = pauVar19 + 1;
                } while ((long)uVar38 < lVar35);
                uVar38 = uVar38 & 0xffffffff;
              }
              if (uVar41 != 0) {
                auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar38));
                auVar68 = vpmullw_avx2(auVar52,auVar68);
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar38 * 2 + uVar31);
                lVar30 = 0;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar30));
                  *(undefined1 (*) [32])(local_240 + lVar30) = auVar48;
                  lVar30 = lVar30 + 0x20;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
                } while (lVar30 != 0xe0);
              }
              iVar42 = iVar42 + iVar37;
              piVar18 = piVar18 + (int)(iVar37 * uVar24);
              piVar23 = piVar23 + (int)(iVar37 * uVar24);
            } while (iVar42 < v_end);
            auVar68 = vphaddd_avx2(local_240,local_220);
            auVar48 = vphaddd_avx2(local_200,local_1e0);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar17 * 7) = auVar68;
            auVar68 = vphaddd_avx2(local_1c0,local_1a0);
            auVar48 = vphaddd_avx2(local_180,local_180);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar17 * 7 + 4) = auVar68;
            bVar43 = uVar17 < 6;
            uVar31 = uVar31 + 2;
            uVar17 = uVar17 + 1;
          } while (bVar43);
        }
        uVar33 = uVar33 + 7;
        local_290 = local_290 + 1;
        local_278 = local_278 + 2;
      } while (local_290 != 8);
      lVar30 = (long)(int)(uVar24 * 2);
      local_290 = 1;
      local_278 = 2;
      uVar33 = 2;
      do {
        cVar14 = (char)(((uint)uVar33 & 0xff) * 0x25 >> 8);
        piVar18 = dgd_avg + ((byte)(((byte)((char)uVar33 - cVar14) >> 1) + cVar14) >> 2);
        piVar22 = piVar18 + lVar30;
        local_180._0_16_ = ZEXT816(0);
        local_180 = ZEXT1632(local_180._0_16_);
        local_1a0._0_16_ = ZEXT816(0);
        local_1a0 = ZEXT1632(local_1a0._0_16_);
        local_1c0._0_16_ = ZEXT816(0);
        local_1c0 = ZEXT1632(local_1c0._0_16_);
        local_1e0._0_16_ = ZEXT816(0);
        local_1e0 = ZEXT1632(local_1e0._0_16_);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar23 = piVar22;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar53._0_2_ = (undefined2)iVar37;
          auVar53._2_2_ = auVar53._0_2_;
          auVar53._4_2_ = auVar53._0_2_;
          auVar53._6_2_ = auVar53._0_2_;
          auVar53._8_2_ = auVar53._0_2_;
          auVar53._10_2_ = auVar53._0_2_;
          auVar53._12_2_ = auVar53._0_2_;
          auVar53._14_2_ = auVar53._0_2_;
          auVar53._16_2_ = auVar53._0_2_;
          auVar53._18_2_ = auVar53._0_2_;
          auVar53._20_2_ = auVar53._0_2_;
          auVar53._22_2_ = auVar53._0_2_;
          auVar53._24_2_ = auVar53._0_2_;
          auVar53._26_2_ = auVar53._0_2_;
          auVar53._28_2_ = auVar53._0_2_;
          auVar53._30_2_ = auVar53._0_2_;
          if ((int)uVar21 < 1) {
            uVar31 = 0;
          }
          else {
            pauVar19 = (undefined1 (*) [32])(piVar18 + lVar30);
            uVar31 = 0;
            do {
              auVar68 = vpmullw_avx2(auVar53,*(undefined1 (*) [32])(piVar23 + uVar31));
              lVar39 = 0;
              pauVar20 = pauVar19;
              do {
                auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                lVar39 = lVar39 + 0x20;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
              } while (lVar39 != 0xa0);
              uVar31 = uVar31 + 0x10;
              pauVar19 = pauVar19 + 1;
            } while ((long)uVar31 < lVar35);
            uVar31 = uVar31 & 0xffffffff;
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar31));
            auVar68 = vpmullw_avx2(auVar53,auVar68);
            pauVar19 = (undefined1 (*) [32])(piVar18 + uVar31 + lVar30);
            lVar39 = 0;
            do {
              auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
              auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
              *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
              lVar39 = lVar39 + 0x20;
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
            } while (lVar39 != 0xa0);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar24);
          piVar23 = piVar23 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vphaddd_avx2(local_240,local_220);
        auVar48 = vphaddd_avx2(local_200,local_1e0);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        *(undefined1 (*) [32])(H + uVar33 * 0x32) = auVar68;
        auVar68 = vpmovsxdq_avx2(local_1c0._0_16_);
        auVar48 = vpmovsxdq_avx2(local_1c0._16_16_);
        auVar68 = vpaddq_avx2(auVar68,auVar48);
        auVar48 = vpshufd_avx2(auVar68,0x44);
        auVar68 = vpshufd_avx2(auVar68,0xee);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        auVar46 = vpaddq_avx(auVar68._0_16_,auVar68._16_16_);
        H[uVar33 * 0x32 + 4] = auVar46._0_8_;
        uVar31 = local_278;
        uVar17 = local_290;
        if (uVar33 < 0x2a) {
          do {
            local_180._0_16_ = ZEXT816(0);
            local_180 = ZEXT1632(local_180._0_16_);
            local_1a0._0_16_ = ZEXT816(0);
            local_1a0 = ZEXT1632(local_1a0._0_16_);
            local_1c0._0_16_ = ZEXT816(0);
            local_1c0 = ZEXT1632(local_1c0._0_16_);
            local_1e0._0_16_ = ZEXT816(0);
            local_1e0 = ZEXT1632(local_1e0._0_16_);
            local_200._0_16_ = ZEXT816(0);
            local_200 = ZEXT1632(local_200._0_16_);
            local_220._0_16_ = ZEXT816(0);
            local_220 = ZEXT1632(local_220._0_16_);
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar18 = dgd_avg;
            piVar23 = piVar22;
            iVar42 = v_start;
            iVar37 = iVar15;
            do {
              iVar32 = v_end - iVar42;
              if (3 < v_end - iVar42) {
                iVar32 = iVar37;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar32 = iVar37;
              }
              iVar37 = iVar32;
              auVar54._0_2_ = (undefined2)iVar37;
              auVar54._2_2_ = auVar54._0_2_;
              auVar54._4_2_ = auVar54._0_2_;
              auVar54._6_2_ = auVar54._0_2_;
              auVar54._8_2_ = auVar54._0_2_;
              auVar54._10_2_ = auVar54._0_2_;
              auVar54._12_2_ = auVar54._0_2_;
              auVar54._14_2_ = auVar54._0_2_;
              auVar54._16_2_ = auVar54._0_2_;
              auVar54._18_2_ = auVar54._0_2_;
              auVar54._20_2_ = auVar54._0_2_;
              auVar54._22_2_ = auVar54._0_2_;
              auVar54._24_2_ = auVar54._0_2_;
              auVar54._26_2_ = auVar54._0_2_;
              auVar54._28_2_ = auVar54._0_2_;
              auVar54._30_2_ = auVar54._0_2_;
              if ((int)uVar21 < 1) {
                uVar38 = 0;
              }
              else {
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar31);
                uVar38 = 0;
                do {
                  auVar68 = vpmullw_avx2(auVar54,*(undefined1 (*) [32])(piVar23 + uVar38));
                  lVar39 = 0;
                  pauVar20 = pauVar19;
                  do {
                    auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                    auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                    *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                    lVar39 = lVar39 + 0x20;
                    pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                  } while (lVar39 != 0xe0);
                  uVar38 = uVar38 + 0x10;
                  pauVar19 = pauVar19 + 1;
                } while ((long)uVar38 < lVar35);
                uVar38 = uVar38 & 0xffffffff;
              }
              if (uVar41 != 0) {
                auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar38));
                auVar68 = vpmullw_avx2(auVar54,auVar68);
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar38 * 2 + uVar31);
                lVar39 = 0;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                  *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                  lVar39 = lVar39 + 0x20;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
                } while (lVar39 != 0xe0);
              }
              iVar42 = iVar42 + iVar37;
              piVar18 = piVar18 + (int)(iVar37 * uVar24);
              piVar23 = piVar23 + (int)(iVar37 * uVar24);
            } while (iVar42 < v_end);
            auVar68 = vphaddd_avx2(local_240,local_220);
            auVar48 = vphaddd_avx2(local_200,local_1e0);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar17 * 7) = auVar68;
            auVar68 = vphaddd_avx2(local_1c0,local_1a0);
            auVar48 = vphaddd_avx2(local_180,local_180);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar17 * 7 + 4) = auVar68;
            bVar43 = uVar17 < 6;
            uVar31 = uVar31 + 2;
            uVar17 = uVar17 + 1;
          } while (bVar43);
        }
        uVar33 = uVar33 + 7;
        local_290 = local_290 + 1;
        local_278 = local_278 + 2;
      } while (local_290 != 8);
      lVar30 = (long)(int)(uVar24 * 3);
      local_290 = 1;
      uVar33 = 3;
      local_278 = 2;
      do {
        cVar14 = (char)(((uint)uVar33 & 0xff) * 0x25 >> 8);
        piVar18 = dgd_avg + ((byte)(((byte)((char)uVar33 - cVar14) >> 1) + cVar14) >> 2);
        piVar22 = piVar18 + lVar30;
        local_180._0_16_ = ZEXT816(0);
        local_180 = ZEXT1632(local_180._0_16_);
        local_1a0._0_16_ = ZEXT816(0);
        local_1a0 = ZEXT1632(local_1a0._0_16_);
        local_1c0._0_16_ = ZEXT816(0);
        local_1c0 = ZEXT1632(local_1c0._0_16_);
        local_1e0._0_16_ = ZEXT816(0);
        local_1e0 = ZEXT1632(local_1e0._0_16_);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar23 = piVar22;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar55._0_2_ = (undefined2)iVar37;
          auVar55._2_2_ = auVar55._0_2_;
          auVar55._4_2_ = auVar55._0_2_;
          auVar55._6_2_ = auVar55._0_2_;
          auVar55._8_2_ = auVar55._0_2_;
          auVar55._10_2_ = auVar55._0_2_;
          auVar55._12_2_ = auVar55._0_2_;
          auVar55._14_2_ = auVar55._0_2_;
          auVar55._16_2_ = auVar55._0_2_;
          auVar55._18_2_ = auVar55._0_2_;
          auVar55._20_2_ = auVar55._0_2_;
          auVar55._22_2_ = auVar55._0_2_;
          auVar55._24_2_ = auVar55._0_2_;
          auVar55._26_2_ = auVar55._0_2_;
          auVar55._28_2_ = auVar55._0_2_;
          auVar55._30_2_ = auVar55._0_2_;
          if ((int)uVar21 < 1) {
            uVar31 = 0;
          }
          else {
            pauVar19 = (undefined1 (*) [32])(piVar18 + lVar30);
            uVar31 = 0;
            do {
              auVar68 = vpmullw_avx2(auVar55,*(undefined1 (*) [32])(piVar23 + uVar31));
              lVar39 = 0;
              pauVar20 = pauVar19;
              do {
                auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                lVar39 = lVar39 + 0x20;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
              } while (lVar39 != 0x80);
              uVar31 = uVar31 + 0x10;
              pauVar19 = pauVar19 + 1;
            } while ((long)uVar31 < lVar35);
            uVar31 = uVar31 & 0xffffffff;
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar31));
            auVar68 = vpmullw_avx2(auVar55,auVar68);
            pauVar19 = (undefined1 (*) [32])(piVar18 + uVar31 + lVar30);
            lVar39 = 0;
            do {
              auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
              auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
              *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
              lVar39 = lVar39 + 0x20;
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
            } while (lVar39 != 0x80);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar24);
          piVar23 = piVar23 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vphaddd_avx2(local_240,local_220);
        auVar48 = vphaddd_avx2(local_200,local_1e0);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        *(undefined1 (*) [32])(H + uVar33 * 0x32) = auVar68;
        uVar31 = local_290;
        uVar17 = local_278;
        if (uVar33 < 0x2a) {
          do {
            local_180._0_16_ = ZEXT816(0);
            local_180 = ZEXT1632(local_180._0_16_);
            local_1a0._0_16_ = ZEXT816(0);
            local_1a0 = ZEXT1632(local_1a0._0_16_);
            local_1c0._0_16_ = ZEXT816(0);
            local_1c0 = ZEXT1632(local_1c0._0_16_);
            local_1e0._0_16_ = ZEXT816(0);
            local_1e0 = ZEXT1632(local_1e0._0_16_);
            local_200._0_16_ = ZEXT816(0);
            local_200 = ZEXT1632(local_200._0_16_);
            local_220._0_16_ = ZEXT816(0);
            local_220 = ZEXT1632(local_220._0_16_);
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar23 = piVar22;
            piVar18 = dgd_avg;
            iVar42 = v_start;
            iVar37 = iVar15;
            do {
              iVar32 = v_end - iVar42;
              if (3 < v_end - iVar42) {
                iVar32 = iVar37;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar32 = iVar37;
              }
              iVar37 = iVar32;
              auVar56._0_2_ = (undefined2)iVar37;
              auVar56._2_2_ = auVar56._0_2_;
              auVar56._4_2_ = auVar56._0_2_;
              auVar56._6_2_ = auVar56._0_2_;
              auVar56._8_2_ = auVar56._0_2_;
              auVar56._10_2_ = auVar56._0_2_;
              auVar56._12_2_ = auVar56._0_2_;
              auVar56._14_2_ = auVar56._0_2_;
              auVar56._16_2_ = auVar56._0_2_;
              auVar56._18_2_ = auVar56._0_2_;
              auVar56._20_2_ = auVar56._0_2_;
              auVar56._22_2_ = auVar56._0_2_;
              auVar56._24_2_ = auVar56._0_2_;
              auVar56._26_2_ = auVar56._0_2_;
              auVar56._28_2_ = auVar56._0_2_;
              auVar56._30_2_ = auVar56._0_2_;
              if ((int)uVar21 < 1) {
                uVar38 = 0;
              }
              else {
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar17);
                uVar38 = 0;
                do {
                  auVar68 = vpmullw_avx2(auVar56,*(undefined1 (*) [32])(piVar23 + uVar38));
                  lVar39 = 0;
                  pauVar20 = pauVar19;
                  do {
                    auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                    auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                    *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                    lVar39 = lVar39 + 0x20;
                    pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                  } while (lVar39 != 0xe0);
                  uVar38 = uVar38 + 0x10;
                  pauVar19 = pauVar19 + 1;
                } while ((long)uVar38 < lVar35);
                uVar38 = uVar38 & 0xffffffff;
              }
              if (uVar41 != 0) {
                auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar38));
                auVar68 = vpmullw_avx2(auVar56,auVar68);
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar38 * 2 + uVar17);
                lVar39 = 0;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                  *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                  lVar39 = lVar39 + 0x20;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
                } while (lVar39 != 0xe0);
              }
              iVar42 = iVar42 + iVar37;
              piVar18 = piVar18 + (int)(iVar37 * uVar24);
              piVar23 = piVar23 + (int)(iVar37 * uVar24);
            } while (iVar42 < v_end);
            auVar68 = vphaddd_avx2(local_240,local_220);
            auVar48 = vphaddd_avx2(local_200,local_1e0);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar31 * 7) = auVar68;
            auVar68 = vphaddd_avx2(local_1c0,local_1a0);
            auVar48 = vphaddd_avx2(local_180,local_180);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar31 * 7 + 4) = auVar68;
            bVar43 = uVar31 < 6;
            uVar31 = uVar31 + 1;
            uVar17 = uVar17 + 2;
          } while (bVar43);
        }
        uVar33 = uVar33 + 7;
        local_290 = local_290 + 1;
        local_278 = local_278 + 2;
      } while (local_290 != 8);
      lVar30 = (long)(int)(uVar24 * 4);
      local_290 = 1;
      uVar33 = 4;
      local_278 = 2;
      do {
        cVar14 = (char)(((uint)uVar33 & 0xff) * 0x25 >> 8);
        piVar18 = dgd_avg + ((byte)(((byte)((char)uVar33 - cVar14) >> 1) + cVar14) >> 2);
        piVar22 = piVar18 + lVar30;
        local_180._0_16_ = ZEXT816(0);
        local_180 = ZEXT1632(local_180._0_16_);
        local_1a0._0_16_ = ZEXT816(0);
        local_1a0 = ZEXT1632(local_1a0._0_16_);
        local_1c0._0_16_ = ZEXT816(0);
        local_1c0 = ZEXT1632(local_1c0._0_16_);
        local_1e0._0_16_ = ZEXT816(0);
        local_1e0 = ZEXT1632(local_1e0._0_16_);
        local_200._0_16_ = ZEXT816(0);
        local_200 = ZEXT1632(local_200._0_16_);
        local_220._0_16_ = ZEXT816(0);
        local_220 = ZEXT1632(local_220._0_16_);
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar23 = piVar22;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar57._0_2_ = (undefined2)iVar37;
          auVar57._2_2_ = auVar57._0_2_;
          auVar57._4_2_ = auVar57._0_2_;
          auVar57._6_2_ = auVar57._0_2_;
          auVar57._8_2_ = auVar57._0_2_;
          auVar57._10_2_ = auVar57._0_2_;
          auVar57._12_2_ = auVar57._0_2_;
          auVar57._14_2_ = auVar57._0_2_;
          auVar57._16_2_ = auVar57._0_2_;
          auVar57._18_2_ = auVar57._0_2_;
          auVar57._20_2_ = auVar57._0_2_;
          auVar57._22_2_ = auVar57._0_2_;
          auVar57._24_2_ = auVar57._0_2_;
          auVar57._26_2_ = auVar57._0_2_;
          auVar57._28_2_ = auVar57._0_2_;
          auVar57._30_2_ = auVar57._0_2_;
          if ((int)uVar21 < 1) {
            uVar31 = 0;
          }
          else {
            pauVar19 = (undefined1 (*) [32])(piVar18 + lVar30);
            uVar31 = 0;
            do {
              auVar68 = vpmullw_avx2(auVar57,*(undefined1 (*) [32])(piVar23 + uVar31));
              lVar39 = 0;
              pauVar20 = pauVar19;
              do {
                auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                lVar39 = lVar39 + 0x20;
                pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
              } while (lVar39 != 0x60);
              uVar31 = uVar31 + 0x10;
              pauVar19 = pauVar19 + 1;
            } while ((long)uVar31 < lVar35);
            uVar31 = uVar31 & 0xffffffff;
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar31));
            auVar68 = vpmullw_avx2(auVar57,auVar68);
            pauVar19 = (undefined1 (*) [32])(piVar18 + uVar31 + lVar30);
            lVar39 = 0;
            do {
              auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
              auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
              *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
              lVar39 = lVar39 + 0x20;
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
            } while (lVar39 != 0x60);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar24);
          piVar23 = piVar23 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vphaddd_avx2(local_240,local_220);
        auVar48 = vphaddd_avx2(local_200,local_1e0);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        *(undefined1 (*) [32])(H + uVar33 * 0x32) = auVar68;
        uVar31 = local_290;
        uVar17 = local_278;
        if (uVar33 < 0x2a) {
          do {
            local_180._0_16_ = ZEXT816(0);
            local_180 = ZEXT1632(local_180._0_16_);
            local_1a0._0_16_ = ZEXT816(0);
            local_1a0 = ZEXT1632(local_1a0._0_16_);
            local_1c0._0_16_ = ZEXT816(0);
            local_1c0 = ZEXT1632(local_1c0._0_16_);
            local_1e0._0_16_ = ZEXT816(0);
            local_1e0 = ZEXT1632(local_1e0._0_16_);
            local_200._0_16_ = ZEXT816(0);
            local_200 = ZEXT1632(local_200._0_16_);
            local_220._0_16_ = ZEXT816(0);
            local_220 = ZEXT1632(local_220._0_16_);
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar23 = piVar22;
            piVar18 = dgd_avg;
            iVar42 = v_start;
            iVar37 = iVar15;
            do {
              iVar32 = v_end - iVar42;
              if (3 < v_end - iVar42) {
                iVar32 = iVar37;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar32 = iVar37;
              }
              iVar37 = iVar32;
              auVar58._0_2_ = (undefined2)iVar37;
              auVar58._2_2_ = auVar58._0_2_;
              auVar58._4_2_ = auVar58._0_2_;
              auVar58._6_2_ = auVar58._0_2_;
              auVar58._8_2_ = auVar58._0_2_;
              auVar58._10_2_ = auVar58._0_2_;
              auVar58._12_2_ = auVar58._0_2_;
              auVar58._14_2_ = auVar58._0_2_;
              auVar58._16_2_ = auVar58._0_2_;
              auVar58._18_2_ = auVar58._0_2_;
              auVar58._20_2_ = auVar58._0_2_;
              auVar58._22_2_ = auVar58._0_2_;
              auVar58._24_2_ = auVar58._0_2_;
              auVar58._26_2_ = auVar58._0_2_;
              auVar58._28_2_ = auVar58._0_2_;
              auVar58._30_2_ = auVar58._0_2_;
              if ((int)uVar21 < 1) {
                uVar38 = 0;
              }
              else {
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar17);
                uVar38 = 0;
                do {
                  auVar68 = vpmullw_avx2(auVar58,*(undefined1 (*) [32])(piVar23 + uVar38));
                  lVar39 = 0;
                  pauVar20 = pauVar19;
                  do {
                    auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                    auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                    *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                    lVar39 = lVar39 + 0x20;
                    pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                  } while (lVar39 != 0xe0);
                  uVar38 = uVar38 + 0x10;
                  pauVar19 = pauVar19 + 1;
                } while ((long)uVar38 < lVar35);
                uVar38 = uVar38 & 0xffffffff;
              }
              if (uVar41 != 0) {
                auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar38));
                auVar68 = vpmullw_avx2(auVar58,auVar68);
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar38 * 2 + uVar17);
                lVar39 = 0;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar39));
                  *(undefined1 (*) [32])(local_240 + lVar39) = auVar48;
                  lVar39 = lVar39 + 0x20;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
                } while (lVar39 != 0xe0);
              }
              iVar42 = iVar42 + iVar37;
              piVar18 = piVar18 + (int)(iVar37 * uVar24);
              piVar23 = piVar23 + (int)(iVar37 * uVar24);
            } while (iVar42 < v_end);
            auVar68 = vphaddd_avx2(local_240,local_220);
            auVar48 = vphaddd_avx2(local_200,local_1e0);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar31 * 7) = auVar68;
            auVar68 = vphaddd_avx2(local_1c0,local_1a0);
            auVar48 = vphaddd_avx2(local_180,local_180);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar31 * 7 + 4) = auVar68;
            bVar43 = uVar31 < 6;
            uVar31 = uVar31 + 1;
            uVar17 = uVar17 + 2;
          } while (bVar43);
        }
        uVar33 = uVar33 + 7;
        local_290 = local_290 + 1;
        local_278 = local_278 + 2;
      } while (local_290 != 8);
      lVar30 = (long)(int)(uVar24 * 5);
      local_278 = 1;
      uVar33 = 5;
      local_248 = 2;
      do {
        cVar14 = (char)(((uint)uVar33 & 0xff) * 0x25 >> 8);
        piVar18 = dgd_avg + ((byte)(((byte)((char)uVar33 - cVar14) >> 1) + cVar14) >> 2);
        piVar22 = piVar18 + lVar30;
        auVar49 = ZEXT1664((undefined1  [16])0x0);
        auVar76 = ZEXT1664((undefined1  [16])0x0);
        piVar23 = piVar22;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar77._0_2_ = (undefined2)iVar37;
          auVar77._2_2_ = auVar77._0_2_;
          auVar77._4_2_ = auVar77._0_2_;
          auVar77._6_2_ = auVar77._0_2_;
          auVar77._8_2_ = auVar77._0_2_;
          auVar77._10_2_ = auVar77._0_2_;
          auVar77._12_2_ = auVar77._0_2_;
          auVar77._14_2_ = auVar77._0_2_;
          auVar77._16_2_ = auVar77._0_2_;
          auVar77._18_2_ = auVar77._0_2_;
          auVar77._20_2_ = auVar77._0_2_;
          auVar77._22_2_ = auVar77._0_2_;
          auVar77._24_2_ = auVar77._0_2_;
          auVar77._26_2_ = auVar77._0_2_;
          auVar77._28_2_ = auVar77._0_2_;
          auVar77._30_2_ = auVar77._0_2_;
          if ((int)uVar21 < 1) {
            lVar39 = 0;
          }
          else {
            lVar39 = 0;
            do {
              auVar48 = vpmullw_avx2(auVar77,*(undefined1 (*) [32])(piVar23 + lVar39));
              auVar68 = vpmaddwd_avx2(auVar48,*(undefined1 (*) [32])(piVar18 + lVar30 + lVar39));
              auVar48 = vpmaddwd_avx2(auVar48,*(undefined1 (*) [32])
                                               (piVar18 + lVar30 + lVar29 + lVar39));
              auVar68 = vpaddd_avx2(auVar68,auVar76._0_32_);
              auVar76 = ZEXT3264(auVar68);
              auVar68 = vpaddd_avx2(auVar48,auVar49._0_32_);
              auVar49 = ZEXT3264(auVar68);
              lVar39 = lVar39 + 0x10;
            } while (lVar39 < lVar35);
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + lVar39));
            auVar48 = vpmullw_avx2(auVar77,auVar68);
            auVar68 = vpmaddwd_avx2(auVar48,*(undefined1 (*) [32])(piVar18 + lVar39 + lVar30));
            auVar68 = vpaddd_avx2(auVar68,auVar76._0_32_);
            auVar76 = ZEXT3264(auVar68);
            auVar68 = vpmaddwd_avx2(auVar48,*(undefined1 (*) [32])
                                             (*(undefined1 (*) [32])(piVar18 + lVar39 + lVar30) +
                                             lVar29 * 2));
            auVar68 = vpaddd_avx2(auVar68,auVar49._0_32_);
            auVar49 = ZEXT3264(auVar68);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar24);
          piVar23 = piVar23 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar68 = vphaddd_avx2(auVar76._0_32_,auVar49._0_32_);
        auVar47 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar68 = vphaddd_avx2(auVar68,auVar47);
        auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
        auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
        auVar68 = vpaddq_avx2(auVar48,auVar68);
        *(undefined1 (*) [32])(H + uVar33 * 0x32) = auVar68;
        uVar31 = local_278;
        lVar39 = local_248;
        if (uVar33 < 0x2a) {
          do {
            local_180 = auVar47;
            local_1a0 = auVar47;
            local_1c0 = auVar47;
            local_1e0 = auVar47;
            local_200 = auVar47;
            local_220 = auVar47;
            local_240 = auVar47;
            piVar18 = piVar22;
            piVar23 = dgd_avg;
            iVar42 = v_start;
            iVar37 = iVar15;
            do {
              iVar32 = v_end - iVar42;
              if (3 < v_end - iVar42) {
                iVar32 = iVar37;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar32 = iVar37;
              }
              iVar37 = iVar32;
              auVar59._0_2_ = (undefined2)iVar37;
              auVar59._2_2_ = auVar59._0_2_;
              auVar59._4_2_ = auVar59._0_2_;
              auVar59._6_2_ = auVar59._0_2_;
              auVar59._8_2_ = auVar59._0_2_;
              auVar59._10_2_ = auVar59._0_2_;
              auVar59._12_2_ = auVar59._0_2_;
              auVar59._14_2_ = auVar59._0_2_;
              auVar59._16_2_ = auVar59._0_2_;
              auVar59._18_2_ = auVar59._0_2_;
              auVar59._20_2_ = auVar59._0_2_;
              auVar59._22_2_ = auVar59._0_2_;
              auVar59._24_2_ = auVar59._0_2_;
              auVar59._26_2_ = auVar59._0_2_;
              auVar59._28_2_ = auVar59._0_2_;
              auVar59._30_2_ = auVar59._0_2_;
              if ((int)uVar21 < 1) {
                uVar17 = 0;
              }
              else {
                pauVar19 = (undefined1 (*) [32])(lVar39 + (long)piVar23);
                uVar17 = 0;
                do {
                  auVar68 = vpmullw_avx2(auVar59,*(undefined1 (*) [32])(piVar18 + uVar17));
                  lVar25 = 0;
                  pauVar20 = pauVar19;
                  do {
                    auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                    auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar25));
                    *(undefined1 (*) [32])(local_240 + lVar25) = auVar48;
                    lVar25 = lVar25 + 0x20;
                    pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                  } while (lVar25 != 0xe0);
                  uVar17 = uVar17 + 0x10;
                  pauVar19 = pauVar19 + 1;
                } while ((long)uVar17 < lVar35);
                uVar17 = uVar17 & 0xffffffff;
              }
              if (uVar41 != 0) {
                auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar18 + uVar17));
                auVar68 = vpmullw_avx2(auVar59,auVar68);
                pauVar19 = (undefined1 (*) [32])((long)piVar23 + uVar17 * 2 + lVar39);
                lVar25 = 0;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar25));
                  *(undefined1 (*) [32])(local_240 + lVar25) = auVar48;
                  lVar25 = lVar25 + 0x20;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
                } while (lVar25 != 0xe0);
              }
              iVar42 = iVar42 + iVar37;
              piVar23 = piVar23 + (int)(iVar37 * uVar24);
              piVar18 = piVar18 + (int)(iVar37 * uVar24);
            } while (iVar42 < v_end);
            auVar68 = vphaddd_avx2(local_240,local_220);
            auVar48 = vphaddd_avx2(local_200,local_1e0);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar31 * 7) = auVar68;
            auVar68 = vphaddd_avx2(local_1c0,local_1a0);
            auVar48 = vphaddd_avx2(local_180,local_180);
            auVar68 = vphaddd_avx2(auVar68,auVar48);
            auVar48 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar48,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar31 * 7 + 4) = auVar68;
            bVar43 = uVar31 < 6;
            uVar31 = uVar31 + 1;
            lVar39 = lVar39 + 2;
          } while (bVar43);
        }
        uVar33 = uVar33 + 7;
        local_278 = local_278 + 1;
        local_248 = local_248 + 2;
      } while (local_278 != 8);
      lVar29 = (long)(int)(uVar24 * 6);
      local_288 = 1;
      uVar33 = 6;
      local_290 = 2;
      do {
        cVar14 = (char)(((uint)uVar33 & 0xff) * 0x25 >> 8);
        piVar18 = dgd_avg + ((byte)(((byte)((char)uVar33 - cVar14) >> 1) + cVar14) >> 2);
        piVar22 = piVar18 + lVar29;
        auVar49 = ZEXT1664((undefined1  [16])0x0);
        piVar23 = piVar22;
        iVar42 = v_start;
        iVar37 = iVar15;
        do {
          iVar32 = v_end - iVar42;
          if (3 < v_end - iVar42) {
            iVar32 = iVar37;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar32 = iVar37;
          }
          iVar37 = iVar32;
          auVar72._0_2_ = (undefined2)iVar37;
          auVar72._2_2_ = auVar72._0_2_;
          auVar72._4_2_ = auVar72._0_2_;
          auVar72._6_2_ = auVar72._0_2_;
          auVar72._8_2_ = auVar72._0_2_;
          auVar72._10_2_ = auVar72._0_2_;
          auVar72._12_2_ = auVar72._0_2_;
          auVar72._14_2_ = auVar72._0_2_;
          auVar72._16_2_ = auVar72._0_2_;
          auVar72._18_2_ = auVar72._0_2_;
          auVar72._20_2_ = auVar72._0_2_;
          auVar72._22_2_ = auVar72._0_2_;
          auVar72._24_2_ = auVar72._0_2_;
          auVar72._26_2_ = auVar72._0_2_;
          auVar72._28_2_ = auVar72._0_2_;
          auVar72._30_2_ = auVar72._0_2_;
          if ((int)uVar21 < 1) {
            lVar30 = 0;
          }
          else {
            lVar30 = 0;
            do {
              auVar68 = vpmullw_avx2(auVar72,*(undefined1 (*) [32])(piVar23 + lVar30));
              auVar68 = vpmaddwd_avx2(auVar68,*(undefined1 (*) [32])(piVar18 + lVar29 + lVar30));
              auVar68 = vpaddd_avx2(auVar68,auVar49._0_32_);
              auVar49 = ZEXT3264(auVar68);
              lVar30 = lVar30 + 0x10;
            } while (lVar30 < lVar35);
          }
          if (uVar41 != 0) {
            auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + lVar30));
            auVar68 = vpmullw_avx2(auVar72,auVar68);
            auVar68 = vpmaddwd_avx2(auVar68,*(undefined1 (*) [32])(piVar18 + lVar30 + lVar29));
            auVar68 = vpaddd_avx2(auVar68,auVar49._0_32_);
            auVar49 = ZEXT3264(auVar68);
          }
          iVar42 = iVar42 + iVar37;
          piVar18 = piVar18 + (int)(iVar37 * uVar24);
          piVar23 = piVar23 + (int)(iVar37 * uVar24);
        } while (iVar42 < v_end);
        auVar48 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar68 = vphaddd_avx2(auVar49._0_32_,auVar48);
        auVar68 = vphaddd_avx2(auVar68,auVar48);
        auVar46 = vpmovsxdq_avx(auVar68._16_16_);
        auVar2 = vpmovsxdq_avx(auVar68._0_16_);
        auVar46 = vpaddq_avx(auVar2,auVar46);
        H[uVar33 * 0x32] = auVar46._0_8_;
        uVar31 = local_288;
        uVar17 = local_290;
        if (uVar33 < 0x2a) {
          do {
            local_180 = auVar48;
            local_1a0 = auVar48;
            local_1c0 = auVar48;
            local_1e0 = auVar48;
            local_200 = auVar48;
            local_220 = auVar48;
            local_240 = auVar48;
            piVar18 = dgd_avg;
            piVar23 = piVar22;
            iVar42 = v_start;
            iVar37 = iVar15;
            do {
              iVar32 = v_end - iVar42;
              if (3 < v_end - iVar42) {
                iVar32 = iVar37;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar32 = iVar37;
              }
              iVar37 = iVar32;
              auVar60._0_2_ = (undefined2)iVar37;
              auVar60._2_2_ = auVar60._0_2_;
              auVar60._4_2_ = auVar60._0_2_;
              auVar60._6_2_ = auVar60._0_2_;
              auVar60._8_2_ = auVar60._0_2_;
              auVar60._10_2_ = auVar60._0_2_;
              auVar60._12_2_ = auVar60._0_2_;
              auVar60._14_2_ = auVar60._0_2_;
              auVar60._16_2_ = auVar60._0_2_;
              auVar60._18_2_ = auVar60._0_2_;
              auVar60._20_2_ = auVar60._0_2_;
              auVar60._22_2_ = auVar60._0_2_;
              auVar60._24_2_ = auVar60._0_2_;
              auVar60._26_2_ = auVar60._0_2_;
              auVar60._28_2_ = auVar60._0_2_;
              auVar60._30_2_ = auVar60._0_2_;
              if ((int)uVar21 < 1) {
                uVar38 = 0;
              }
              else {
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar17);
                uVar38 = 0;
                do {
                  auVar68 = vpmullw_avx2(auVar60,*(undefined1 (*) [32])(piVar23 + uVar38));
                  lVar30 = 0;
                  pauVar20 = pauVar19;
                  do {
                    auVar47 = vpmaddwd_avx2(auVar68,*pauVar20);
                    auVar47 = vpaddd_avx2(auVar47,*(undefined1 (*) [32])(local_240 + lVar30));
                    *(undefined1 (*) [32])(local_240 + lVar30) = auVar47;
                    lVar30 = lVar30 + 0x20;
                    pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                  } while (lVar30 != 0xe0);
                  uVar38 = uVar38 + 0x10;
                  pauVar19 = pauVar19 + 1;
                } while ((long)uVar38 < lVar35);
                uVar38 = uVar38 & 0xffffffff;
              }
              if (uVar41 != 0) {
                auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar23 + uVar38));
                auVar68 = vpmullw_avx2(auVar60,auVar68);
                pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar38 * 2 + uVar17);
                lVar30 = 0;
                do {
                  auVar47 = vpmaddwd_avx2(auVar68,*pauVar19);
                  auVar47 = vpaddd_avx2(auVar47,*(undefined1 (*) [32])(local_240 + lVar30));
                  *(undefined1 (*) [32])(local_240 + lVar30) = auVar47;
                  lVar30 = lVar30 + 0x20;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
                } while (lVar30 != 0xe0);
              }
              iVar42 = iVar42 + iVar37;
              piVar18 = piVar18 + (int)(iVar37 * uVar24);
              piVar23 = piVar23 + (int)(iVar37 * uVar24);
            } while (iVar42 < v_end);
            auVar68 = vphaddd_avx2(local_240,local_220);
            auVar47 = vphaddd_avx2(local_200,local_1e0);
            auVar68 = vphaddd_avx2(auVar68,auVar47);
            auVar47 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar47,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar31 * 7) = auVar68;
            auVar68 = vphaddd_avx2(local_1c0,local_1a0);
            auVar47 = vphaddd_avx2(local_180,local_180);
            auVar68 = vphaddd_avx2(auVar68,auVar47);
            auVar47 = vpmovsxdq_avx2(auVar68._0_16_);
            auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
            auVar68 = vpaddq_avx2(auVar47,auVar68);
            *(undefined1 (*) [32])(H + uVar33 * 0x31 + uVar31 * 7 + 4) = auVar68;
            bVar43 = uVar31 < 6;
            uVar31 = uVar31 + 1;
            uVar17 = uVar17 + 2;
          } while (bVar43);
        }
        uVar33 = uVar33 + 7;
        local_288 = local_288 + 1;
        local_290 = local_290 + 2;
      } while (local_288 != 8);
      lVar29 = 1;
      local_280 = 6;
      lVar30 = 7;
      do {
        cVar14 = (char)(((uint)lVar30 & 0xff) * 0x25 >> 8);
        lVar40 = 0;
        lVar25 = 0;
        lVar39 = lVar29;
        do {
          local_180._0_16_ = ZEXT816(0);
          local_180 = ZEXT1632(local_180._0_16_);
          local_1a0._0_16_ = ZEXT816(0);
          local_1a0 = ZEXT1632(local_1a0._0_16_);
          local_1c0._0_16_ = ZEXT816(0);
          local_1c0 = ZEXT1632(local_1c0._0_16_);
          local_1e0._0_16_ = ZEXT816(0);
          local_1e0 = ZEXT1632(local_1e0._0_16_);
          local_200._0_16_ = ZEXT816(0);
          local_200 = ZEXT1632(local_200._0_16_);
          local_220._0_16_ = ZEXT816(0);
          local_220 = ZEXT1632(local_220._0_16_);
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          piVar22 = dgd_avg + ((byte)(((byte)((char)lVar30 - cVar14) >> 1) + cVar14) >> 2);
          piVar18 = dgd_avg + ((byte)(((byte)((char)lVar30 - cVar14) >> 1) + cVar14) >> 2);
          iVar37 = iVar15;
          iVar42 = v_start;
          do {
            iVar32 = v_end - iVar42;
            if (3 < v_end - iVar42) {
              iVar32 = iVar37;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar32 = iVar37;
            }
            iVar37 = iVar32;
            auVar61._0_2_ = (undefined2)iVar37;
            auVar61._2_2_ = auVar61._0_2_;
            auVar61._4_2_ = auVar61._0_2_;
            auVar61._6_2_ = auVar61._0_2_;
            auVar61._8_2_ = auVar61._0_2_;
            auVar61._10_2_ = auVar61._0_2_;
            auVar61._12_2_ = auVar61._0_2_;
            auVar61._14_2_ = auVar61._0_2_;
            auVar61._16_2_ = auVar61._0_2_;
            auVar61._18_2_ = auVar61._0_2_;
            auVar61._20_2_ = auVar61._0_2_;
            auVar61._22_2_ = auVar61._0_2_;
            auVar61._24_2_ = auVar61._0_2_;
            auVar61._26_2_ = auVar61._0_2_;
            auVar61._28_2_ = auVar61._0_2_;
            auVar61._30_2_ = auVar61._0_2_;
            if ((int)uVar21 < 1) {
              uVar33 = 0;
            }
            else {
              pauVar19 = (undefined1 (*) [32])((long)piVar18 + lVar40);
              uVar33 = 0;
              do {
                auVar68 = vpmullw_avx2(auVar61,*(undefined1 (*) [32])(piVar22 + uVar33));
                lVar26 = 0;
                pauVar20 = pauVar19;
                do {
                  auVar48 = vpmaddwd_avx2(auVar68,*pauVar20);
                  auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar26));
                  *(undefined1 (*) [32])(local_240 + lVar26) = auVar48;
                  lVar26 = lVar26 + 0x20;
                  pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar34);
                } while (lVar26 != 0xe0);
                uVar33 = uVar33 + 0x10;
                pauVar19 = pauVar19 + 1;
              } while ((long)uVar33 < lVar35);
              uVar33 = uVar33 & 0xffffffff;
            }
            if (uVar41 != 0) {
              auVar68 = vpand_avx2(auVar45,*(undefined1 (*) [32])(piVar22 + uVar33));
              auVar68 = vpmullw_avx2(auVar61,auVar68);
              pauVar19 = (undefined1 (*) [32])((long)piVar18 + uVar33 * 2 + lVar40);
              lVar26 = 0;
              do {
                auVar48 = vpmaddwd_avx2(auVar68,*pauVar19);
                auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(local_240 + lVar26));
                *(undefined1 (*) [32])(local_240 + lVar26) = auVar48;
                lVar26 = lVar26 + 0x20;
                pauVar19 = (undefined1 (*) [32])(*pauVar19 + lVar34);
              } while (lVar26 != 0xe0);
            }
            iVar42 = iVar42 + iVar37;
            piVar18 = piVar18 + (int)(iVar37 * uVar24);
            piVar22 = piVar22 + (int)(iVar37 * uVar24);
          } while (iVar42 < v_end);
          auVar68 = vphaddd_avx2(local_240,local_220);
          auVar48 = vphaddd_avx2(local_200,local_1e0);
          auVar68 = vphaddd_avx2(auVar68,auVar48);
          auVar47 = vpmovsxdq_avx2(auVar68._0_16_);
          auVar68 = vpmovsxdq_avx2(auVar68._16_16_);
          auVar48 = vphaddd_avx2(local_1c0,local_1a0);
          auVar68 = vpaddq_avx2(auVar47,auVar68);
          auVar47 = vphaddd_avx2(local_180,local_180);
          auVar48 = vphaddd_avx2(auVar48,auVar47);
          auVar47 = vpmovsxdq_avx2(auVar48._0_16_);
          auVar48 = vpmovsxdq_avx2(auVar48._16_16_);
          auVar48 = vpaddq_avx2(auVar47,auVar48);
          *(undefined1 (*) [32])(H + lVar30 * 0x31 + lVar39 * 7) = auVar68;
          *(undefined1 (*) [16])(H + lVar30 * 0x31 + lVar39 * 7 + 4) = auVar48._0_16_;
          H[lVar30 * 0x31 + lVar39 * 7 + 6] = auVar48._16_8_;
          lVar25 = lVar25 + 1;
          lVar39 = lVar39 + 1;
          lVar40 = lVar40 + 2;
        } while (lVar25 != local_280);
        lVar30 = lVar30 + 7;
        lVar29 = lVar29 + 1;
        local_280 = local_280 + -1;
      } while (lVar29 != 7);
      pauVar20 = (undefined1 (*) [32])(H + 0xf5);
      pauVar19 = (undefined1 (*) [32])(H + 5);
      uVar33 = 1;
      uVar31 = 0;
      while( true ) {
        auVar45 = vunpcklpd_avx(*(undefined1 (*) [32])(H + uVar31 * 0x32 + 1),
                                *(undefined1 (*) [32])(H + uVar31 * 0x32 + 0x32));
        auVar68 = vunpcklpd_avx(*(undefined1 (*) [32])(H + uVar31 * 0x32 + 99),
                                *(undefined1 (*) [32])(H + uVar31 * 0x32 + 0x94));
        auVar48 = vperm2f128_avx(auVar45,auVar68,0x31);
        auVar45 = vunpckhpd_avx(*(undefined1 (*) [32])(H + uVar31 * 0x32 + 1),
                                *(undefined1 (*) [32])(H + uVar31 * 0x32 + 0x32));
        auVar68 = vunpckhpd_avx(*(undefined1 (*) [32])(H + uVar31 * 0x32 + 99),
                                *(undefined1 (*) [32])(H + uVar31 * 0x32 + 0x94));
        auVar68 = vperm2f128_avx(auVar45,auVar68,0x31);
        H[uVar31 * 0x32 + 0x31] = H[uVar31 * 0x32 + 1];
        *(undefined1 (*) [16])(H + uVar31 * 0x32 + 0x62) = auVar45._0_16_;
        *(undefined1 (*) [32])(H + uVar31 * 0x32 + 0x93) = auVar48;
        *(undefined1 (*) [32])(H + uVar31 * 0x32 + 0xc4) = auVar68;
        if (0x2b < uVar31) break;
        uVar31 = uVar31 + 4;
        pauVar27 = pauVar20;
        pauVar36 = pauVar19;
        uVar17 = uVar33;
        do {
          auVar48 = vpunpcklqdq_avx2(*pauVar36,*(undefined1 (*) [32])(pauVar36[0xc] + 8));
          auVar47 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(pauVar36[0x18] + 0x10),
                                     *(undefined1 (*) [32])(pauVar36[0x24] + 0x18));
          auVar45 = vpunpckhqdq_avx2(*pauVar36,*(undefined1 (*) [32])(pauVar36[0xc] + 8));
          auVar68 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(pauVar36[0x18] + 0x10),
                                     *(undefined1 (*) [32])(pauVar36[0x24] + 0x18));
          auVar62._0_16_ = ZEXT116(0) * auVar47._0_16_ + ZEXT116(1) * auVar48._0_16_;
          auVar62._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar47._0_16_;
          auVar73._0_16_ = ZEXT116(0) * auVar68._0_16_ + ZEXT116(1) * auVar45._0_16_;
          auVar73._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar68._0_16_;
          auVar48 = vperm2i128_avx2(auVar48,auVar47,0x31);
          auVar45 = vperm2i128_avx2(auVar45,auVar68,0x31);
          *pauVar27 = auVar62;
          *(undefined1 (*) [32])(pauVar27[0xc] + 8) = auVar73;
          *(undefined1 (*) [32])(pauVar27[0x18] + 0x10) = auVar48;
          *(undefined1 (*) [32])(pauVar27[0x24] + 0x18) = auVar45;
          uVar17 = uVar17 + 4;
          pauVar27 = pauVar27 + 0x31;
          pauVar36 = pauVar36 + 1;
        } while (uVar17 < 0x2d);
        uVar33 = uVar33 + 4;
        pauVar20 = pauVar20 + 0x32;
        pauVar19 = pauVar19 + 0x32;
      }
    }
  }
  else {
    av1_compute_stats_c(wiener_win,dgd,src,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
                        src_stride,M,H,use_downsampled_wiener_stats);
  }
  return;
}

Assistant:

void av1_compute_stats_avx2(int wiener_win, const uint8_t *dgd,
                            const uint8_t *src, int16_t *dgd_avg,
                            int16_t *src_avg, int h_start, int h_end,
                            int v_start, int v_end, int dgd_stride,
                            int src_stride, int64_t *M, int64_t *H,
                            int use_downsampled_wiener_stats) {
  if (wiener_win != WIENER_WIN && wiener_win != WIENER_WIN_CHROMA) {
    // Currently, libaom supports Wiener filter processing with window sizes as
    // WIENER_WIN_CHROMA(5) and WIENER_WIN(7). For any other window size, SIMD
    // support is not facilitated. Hence, invoke C function for the same.
    av1_compute_stats_c(wiener_win, dgd, src, dgd_avg, src_avg, h_start, h_end,
                        v_start, v_end, dgd_stride, src_stride, M, H,
                        use_downsampled_wiener_stats);
    return;
  }

  const int32_t wiener_halfwin = wiener_win >> 1;
  const uint8_t avg =
      calc_dgd_buf_avg_avx2(dgd, h_start, h_end, v_start, v_end, dgd_stride);
  const int32_t width = h_end - h_start;
  const int32_t height = v_end - v_start;
  const int32_t d_stride = (width + 2 * wiener_halfwin + 15) & ~15;
  const int32_t s_stride = (width + 15) & ~15;

  // Based on the sf 'use_downsampled_wiener_stats', process either once for
  // UPDATE_DOWNSAMPLE_FACTOR or for each row.
  sub_avg_block_avx2(src + v_start * src_stride + h_start, src_stride, avg,
                     width, height, src_avg, s_stride,
                     use_downsampled_wiener_stats);

  // Compute (dgd-avg) buffer here which is used to fill H buffer.
  sub_avg_block_avx2(
      dgd + (v_start - wiener_halfwin) * dgd_stride + h_start - wiener_halfwin,
      dgd_stride, avg, width + 2 * wiener_halfwin, height + 2 * wiener_halfwin,
      dgd_avg, d_stride, 0);
  if (wiener_win == WIENER_WIN) {
    compute_stats_win7_avx2(dgd_avg, d_stride, src_avg, s_stride, width,
                            v_start, v_end, M, H, use_downsampled_wiener_stats);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    compute_stats_win5_avx2(dgd_avg, d_stride, src_avg, s_stride, width,
                            v_start, v_end, M, H, use_downsampled_wiener_stats);
  }
}